

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::compSyncResidualFine
          (MLNodeLaplacian *this,MultiFab *sync_resid,MultiFab *phi,MultiFab *vold,MultiFab *rhcc)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Real RVar14;
  LinOpBCType LVar15;
  LinOpBCType LVar16;
  undefined8 *puVar17;
  FabArray<amrex::IArrayBox> *this_00;
  pointer paVar18;
  long lVar19;
  EBCellFlagFab *this_01;
  pointer paVar20;
  FabArray<amrex::FArrayBox> *this_02;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  double *pdVar25;
  double *pdVar26;
  ulong uVar27;
  bool bVar28;
  int i_1;
  FabType FVar29;
  uint uVar30;
  int iVar31;
  EBFArrayBoxFactory *this_03;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  undefined8 *puVar48;
  ulong uVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  undefined8 *puVar59;
  Real *pRVar60;
  Real *pRVar61;
  int j_2;
  long lVar62;
  bool bVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  int iVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  int *piVar83;
  int *piVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  int j;
  long lVar89;
  double *pdVar90;
  long lVar91;
  double *pdVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  int *piVar96;
  long lVar97;
  long lVar98;
  int i_4;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  double *pdVar106;
  long lVar107;
  undefined8 *puVar108;
  Real *pRVar109;
  uint uVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  bool bVar117;
  bool bVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  undefined8 uVar128;
  Real RVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  ulong uVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  long local_cf8;
  long local_cf0;
  long local_ce8;
  long local_ce0;
  long local_cd8;
  double *local_cd0;
  double *local_cc8;
  double *local_cc0;
  long local_cb8;
  double *local_cb0;
  long local_ca8;
  double *local_ca0;
  double *local_c98;
  double *local_c90;
  long local_c88;
  long local_c80;
  long local_c78;
  double *local_c70;
  long local_c68;
  long local_c60;
  long local_c58;
  long local_c50;
  long local_c48;
  long local_c30;
  long local_c28;
  long local_c20;
  long local_c18;
  long local_c10;
  long local_c08;
  long local_c00;
  undefined8 *local_bf8;
  long local_bf0;
  ulong local_be8;
  long local_be0;
  long local_bd8;
  long local_bc8;
  long local_bc0;
  long local_bb8;
  long local_bb0;
  long local_ba8;
  long local_ba0;
  long local_b90;
  long local_b88;
  long local_b78;
  long local_b70;
  long local_b68;
  long local_b60;
  long local_b50;
  long local_b48;
  long local_b38;
  long local_b30;
  long local_b28;
  long local_b18;
  long local_b10;
  long local_b08;
  long local_b00;
  Box local_af8;
  long local_ad8;
  int *local_ad0;
  Box bx_3;
  long local_a80;
  long local_a78;
  long local_a70;
  long local_a68;
  long local_a60;
  long local_a50;
  long local_a48;
  long local_9f0;
  long local_9e8;
  long local_9e0;
  long local_9d8;
  long local_9d0;
  long local_9c8;
  long local_9c0;
  long local_9b8;
  long local_9b0;
  long local_9a0;
  Array4<const_double> local_998;
  long local_958;
  long local_950;
  long local_948;
  long local_940;
  long local_938;
  long local_930;
  long local_928;
  long local_920;
  long local_918;
  double *local_910;
  ulong local_908;
  long local_900;
  long local_8f8;
  undefined4 local_8ec;
  Array4<const_double> local_8e8;
  Box lhs_1;
  int local_888;
  int local_884;
  int local_880;
  Box bx_5;
  FabArray<amrex::FArrayBox> *local_838;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_830;
  long local_810;
  long local_808;
  long local_800;
  long local_7f8;
  int local_7b8;
  int local_7b0;
  Array4<const_double> local_7a8;
  Box bx;
  Box result;
  Box lhs;
  Box local_708;
  FabArray<amrex::EBCellFlagFab> *local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  ulong local_6c0;
  ulong local_6b8;
  Array4<const_double> local_6b0;
  int local_66c;
  Array4<const_double> local_668;
  Box local_624;
  Box lhs_2;
  Box bx_2;
  Real facz;
  Real facy;
  Real facx;
  IArrayBox tmpmask;
  Box bx_1;
  undefined4 uStack_43c;
  int local_438;
  int local_434;
  int local_430;
  MFIter mfi;
  Array4<const_int> local_3b8;
  FArrayBox cn;
  FArrayBox sten;
  FArrayBox u;
  FArrayBox rhs;
  Real fm2xm2y4z;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fmx2y2z;
  Real fxyz;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real facy_2;
  Real facx_2;
  Real facz_2;
  Elixir steneli;
  Elixir rhseli;
  Elixir tmeli;
  Elixir ueli;
  Box local_98;
  Box local_7c;
  Elixir cneli;
  MFItInfo local_44;
  
  puVar17 = *(undefined8 **)
             &(((this->m_sigma).
                super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              ).
              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  this_00 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  paVar18 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6b8 = *(ulong *)paVar18->_M_elems;
  LVar15 = paVar18->_M_elems[2];
  paVar18 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6c0 = *(ulong *)paVar18->_M_elems;
  LVar16 = paVar18->_M_elems[2];
  lVar19 = **(long **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if ((lVar19 == 0) ||
     (this_03 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar19,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0),
     this_03 == (EBFArrayBoxFactory *)0x0)) {
    local_830._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    local_8ec = (undefined4)
                CONCAT71(local_830._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl._1_7_,1);
    local_6e0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_838 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_6e0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_03);
    local_830._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    local_838 = &EBFArrayBoxFactory::getVolFrac(this_03)->super_FabArray<amrex::FArrayBox>;
    local_8ec = 0;
  }
  lVar19 = *(long *)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  bx.smallend.vect._0_8_ = *(undefined8 *)(lVar19 + 0xac);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar19 + 0xb8) >> 0x20);
  bx._20_8_ = *(undefined8 *)(lVar19 + 0xc0);
  bx.smallend.vect[2] = (int)*(undefined8 *)(lVar19 + 0xb4);
  bx.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar19 + 0xb4) >> 0x20);
  for (lVar43 = 0; lVar43 != 3; lVar43 = lVar43 + 1) {
    if ((bx.btype.itype >> ((uint)lVar43 & 0x1f) & 1) == 0) {
      piVar83 = bx.bigend.vect + lVar43;
      *piVar83 = *piVar83 + 1;
    }
  }
  bx.btype.itype = 7;
  dVar2 = *(double *)(lVar19 + 0x38);
  dVar3 = *(double *)(lVar19 + 0x40);
  dVar4 = *(double *)(lVar19 + 0x48);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_007d7ef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  FArrayBox::FArrayBox(&rhs);
  FArrayBox::FArrayBox(&u);
  IArrayBox::IArrayBox(&tmpmask);
  FArrayBox::FArrayBox(&sten);
  FArrayBox::FArrayBox(&cn);
  MFIter::MFIter(&mfi,(FabArrayBase *)sync_resid,&local_44);
  uVar23 = local_6b8;
  uVar22 = local_6c0;
  uVar32 = local_6b8 >> 0x20;
  uVar33 = local_6c0 >> 0x20;
  dVar136 = dVar2 * 0.027777777777777776 * dVar2;
  dVar144 = dVar3 * 0.027777777777777776 * dVar3;
  dVar130 = dVar4 * 0.027777777777777776 * dVar4;
  dVar147 = dVar144 + dVar144;
  dVar119 = dVar136 * 4.0;
  dVar150 = dVar144 * 4.0;
  dVar157 = dVar136 * -2.0;
  dVar120 = dVar136 + dVar144 + dVar130;
  dVar153 = dVar130 + dVar130;
  dVar137 = dVar136 + dVar136;
  dVar138 = -dVar147;
  dVar139 = dVar130 * 4.0;
  dVar154 = -dVar153;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      BaseFab<double>::~BaseFab(&cn.super_BaseFab<double>);
      BaseFab<double>::~BaseFab(&sten.super_BaseFab<double>);
      BaseFab<int>::~BaseFab(&tmpmask.super_BaseFab<int>);
      BaseFab<double>::~BaseFab(&u.super_BaseFab<double>);
      BaseFab<double>::~BaseFab(&rhs.super_BaseFab<double>);
      return;
    }
    MFIter::tilebox(&local_af8,&mfi);
    FVar29 = regular;
    if ((char)local_8ec == '\0') {
      piVar83 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar83 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      this_01 = (local_6e0->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar83];
      bx_1.bigend.vect[1] = local_af8.bigend.vect[1];
      bx_1.bigend.vect[2] = local_af8.bigend.vect[2];
      bx_1.smallend.vect[1] = local_af8.smallend.vect[1];
      bx_1.smallend.vect[0] = local_af8.smallend.vect[0];
      bx_1.smallend.vect[2] = local_af8.smallend.vect[2];
      bx_1.bigend.vect[0] = local_af8.bigend.vect[0];
      for (lVar43 = 0; lVar43 != 3; lVar43 = lVar43 + 1) {
        if ((local_af8.btype.itype >> ((uint)lVar43 & 0x1f) & 1) != 0) {
          piVar83 = bx_1.bigend.vect + lVar43;
          *piVar83 = *piVar83 + -1;
        }
      }
      bx_1.btype.itype = 0;
      FVar29 = EBCellFlagFab::getType(this_01,&bx_1);
      if (FVar29 != covered) goto LAB_0061d15c;
    }
    else {
LAB_0061d15c:
      MFIter::growntilebox(&local_624,&mfi,-1000000);
      MFIter::validbox(&local_7c,&mfi);
      bx_2.bigend.vect[1] = local_7c.bigend.vect[1];
      bx_2.bigend.vect[2] = local_7c.bigend.vect[2];
      bx_2.btype.itype = local_7c.btype.itype;
      bx_2.smallend.vect[0] = local_7c.smallend.vect[0];
      bx_2.smallend.vect[1] = local_7c.smallend.vect[1];
      bx_2.smallend.vect[2] = local_7c.smallend.vect[2];
      bx_2.bigend.vect[0] = local_7c.bigend.vect[0];
      for (lVar43 = 0; lVar43 != 3; lVar43 = lVar43 + 1) {
        if ((bx_2.btype.itype >> ((uint)lVar43 & 0x1f) & 1) != 0) {
          piVar83 = bx_2.bigend.vect + lVar43;
          *piVar83 = *piVar83 + -1;
        }
      }
      bx_2._20_8_ = bx_2._20_8_ & 0xffffffff;
      bx_3.smallend.vect[0] = local_af8.smallend.vect[0] + -1;
      bx_3.smallend.vect[1] = local_af8.smallend.vect[1] + -1;
      bx_3.smallend.vect[2] = local_af8.smallend.vect[2] + -1;
      bx_3.bigend.vect[0] = local_af8.bigend.vect[0] + 1;
      bx_3.bigend.vect[1] = local_af8.bigend.vect[1] + 1;
      bx_3.bigend.vect[2] = local_af8.bigend.vect[2] + 1;
      for (lVar43 = 0; lVar43 != 3; lVar43 = lVar43 + 1) {
        if ((local_af8.btype.itype >> ((uint)lVar43 & 0x1f) & 1) != 0) {
          piVar83 = bx_3.bigend.vect + lVar43;
          *piVar83 = *piVar83 + -1;
        }
      }
      bx_3.btype.itype = 0;
      FArrayBox::resize((FArrayBox *)&u.super_BaseFab<double>,&bx_3,3,(Arena *)0x0);
      BaseFab<double>::elixir<double,_0>(&ueli,&u.super_BaseFab<double>);
      iVar70 = u.super_BaseFab<double>.domain.smallend.vect[2];
      iVar50 = u.super_BaseFab<double>.domain.smallend.vect[1];
      iVar21 = u.super_BaseFab<double>.domain.smallend.vect[0];
      pdVar25 = u.super_BaseFab<double>.dptr;
      lVar71 = (long)u.super_BaseFab<double>.domain.smallend.vect[0];
      lVar73 = (long)u.super_BaseFab<double>.domain.smallend.vect[1];
      lVar64 = (long)u.super_BaseFab<double>.domain.smallend.vect[2];
      lVar43 = (long)((u.super_BaseFab<double>.domain.bigend.vect[1] -
                      u.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
      lVar44 = (long)((u.super_BaseFab<double>.domain.bigend.vect[2] -
                      u.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
      uVar140 = CONCAT44(-(uint)(bx_3.smallend.vect[1] < bx_2.smallend.vect[1]),
                         -(uint)(bx_3.smallend.vect[0] < bx_2.smallend.vect[0]));
      uVar140 = ~uVar140 & CONCAT44(bx_3.smallend.vect[1],bx_3.smallend.vect[0]) |
                bx_2.smallend.vect._0_8_ & uVar140;
      lhs.smallend.vect[0] = (int)uVar140;
      lhs.smallend.vect[1] = (int)(uVar140 >> 0x20);
      lhs.smallend.vect[2] = bx_3.smallend.vect[2];
      if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
        lhs.smallend.vect[2] = bx_2.smallend.vect[2];
      }
      uVar140 = CONCAT44(-(uint)(bx_2.bigend.vect[1] < bx_3.bigend.vect[1]),
                         -(uint)(bx_2.bigend.vect[0] < bx_3.bigend.vect[0]));
      uVar140 = ~uVar140 & CONCAT44(bx_3.bigend.vect[1],bx_3.bigend.vect[0]) |
                CONCAT44(bx_2.bigend.vect[1],bx_2.bigend.vect[0]) & uVar140;
      lhs.bigend.vect[0] = (int)uVar140;
      lhs.bigend.vect[1] = (int)(uVar140 >> 0x20);
      lhs.bigend.vect[2] = bx_2.bigend.vect[2];
      iVar42 = bx_3.bigend.vect[2];
      if (lhs.bigend.vect[2] < bx_3.bigend.vect[2]) {
        iVar42 = lhs.bigend.vect[2];
      }
      lhs.btype.itype = bx_2.btype.itype;
      lhs.bigend.vect[2] = iVar42;
      paVar18 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                .
                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar20 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                .
                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (lVar65 = 0; lVar65 != 0xc; lVar65 = lVar65 + 4) {
        if ((*(int *)((long)paVar18->_M_elems + lVar65) == 0x6a) &&
           (iVar42 = *(int *)((long)lhs.smallend.vect + lVar65),
           iVar42 == *(int *)(lVar19 + 0xac + lVar65))) {
          *(int *)((long)lhs.smallend.vect + lVar65) = iVar42 + -1;
        }
        if ((*(int *)((long)paVar20->_M_elems + lVar65) == 0x6a) &&
           (iVar42 = *(int *)((long)lhs.bigend.vect + lVar65),
           iVar42 == *(int *)(lVar19 + 0xb8 + lVar65))) {
          *(int *)((long)lhs.bigend.vect + lVar65) = iVar42 + 1;
        }
      }
      lVar111 = (long)((u.super_BaseFab<double>.domain.bigend.vect[0] -
                       u.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      lVar102 = lVar43 * lVar111;
      lVar94 = lVar102 * lVar44;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&bx_1,&vold->super_FabArray<amrex::FArrayBox>,&mfi);
      iVar42 = bx_3.smallend.vect[0];
      lVar74 = (long)bx_3.smallend.vect[1];
      lVar78 = (long)bx_3.smallend.vect[2];
      lVar34 = (long)bx_3.bigend.vect[0];
      lVar35 = (long)bx_3.bigend.vect[1];
      lVar36 = (long)bx_3.bigend.vect[2];
      lVar82 = (long)bx_3.smallend.vect[0];
      local_ad8 = lVar71 * 8;
      lVar89 = (lVar74 * 8 + (lVar78 - lVar64) * lVar43 * 8 + lVar73 * -8) * lVar111 + lVar82 * 8 +
               lVar71 * -8 + (long)pdVar25;
      lVar65 = lVar44 * 8;
      lVar51 = ((lVar65 + lVar78 * 8 + lVar64 * -8) * lVar43 + lVar74 * 8 + lVar73 * -8) * lVar111 +
               lVar82 * 8 + lVar71 * -8 + (long)pdVar25;
      lVar40 = lVar102 * 8;
      lVar47 = lVar111 * 8;
      for (; lVar78 <= lVar36; lVar78 = lVar78 + 1) {
        lVar112 = lVar89;
        local_cf8 = lVar51;
        for (lVar103 = lVar74; lVar103 <= lVar35; lVar103 = lVar103 + 1) {
          lVar99 = lVar82;
          for (lVar95 = 0; lVar82 + lVar95 <= lVar34; lVar95 = lVar95 + 1) {
            local_3b8.p._0_4_ = iVar42 + (int)lVar95;
            local_3b8.p._4_4_ = (undefined4)lVar103;
            local_3b8.jstride._0_4_ = (undefined4)lVar78;
            bVar28 = Box::contains(&lhs,(IntVect *)&local_3b8);
            if (bVar28) {
              lVar37 = (long)local_438;
              lVar75 = (lVar103 - local_434) * CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) *
                       8 + (lVar78 - local_430) * CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1])
                           * 8;
              lVar66 = bx_1.smallend.vect._0_8_ + lVar82 * 8;
              lVar45 = (lVar82 - lVar71) + lVar95;
              *(undefined8 *)(lVar112 + lVar95 * 8) =
                   *(undefined8 *)(lVar75 + lVar37 * -8 + lVar66 + lVar95 * 8);
              *(undefined8 *)(local_cf8 + lVar95 * 8) =
                   *(undefined8 *)
                    (lVar75 + CONCAT44(uStack_43c,bx_1.btype.itype) * 8 + lVar37 * -8 + lVar66 +
                    lVar95 * 8);
              dVar127 = *(double *)
                         (CONCAT44(uStack_43c,bx_1.btype.itype) * 0x10 + lVar75 + lVar37 * -8 +
                          lVar66 + lVar95 * 8);
            }
            else {
              lVar45 = lVar99 - lVar71;
              *(undefined8 *)(lVar112 + lVar95 * 8) = 0;
              *(undefined8 *)(local_cf8 + lVar95 * 8) = 0;
              dVar127 = 0.0;
            }
            pdVar25[(lVar78 - lVar64) * lVar102 + (lVar103 - lVar73) * lVar111 + lVar94 * 2 + lVar45
                   ] = dVar127;
            lVar99 = lVar99 + 1;
          }
          lVar112 = lVar112 + lVar47;
          local_cf8 = local_cf8 + lVar47;
        }
        lVar89 = lVar89 + lVar40;
        lVar51 = lVar51 + lVar40;
      }
      IArrayBox::resize((IArrayBox *)&tmpmask.super_BaseFab<int>,&local_af8,1,(Arena *)0x0);
      BaseFab<int>::elixir<int,_0>(&tmeli,&tmpmask.super_BaseFab<int>);
      piVar83 = tmpmask.super_BaseFab<int>.dptr;
      lVar82 = (long)tmpmask.super_BaseFab<int>.domain.smallend.vect[0];
      lVar51 = (long)tmpmask.super_BaseFab<int>.domain.smallend.vect[1];
      lVar34 = (long)tmpmask.super_BaseFab<int>.domain.smallend.vect[2];
      lVar35 = (long)((tmpmask.super_BaseFab<int>.domain.bigend.vect[0] -
                      tmpmask.super_BaseFab<int>.domain.smallend.vect[0]) + 1);
      lVar74 = (long)((tmpmask.super_BaseFab<int>.domain.bigend.vect[1] -
                      tmpmask.super_BaseFab<int>.domain.smallend.vect[1]) + 1);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_3b8,this_00,&mfi);
      lVar36 = (long)local_af8.smallend.vect[2];
      local_ad0 = piVar83;
      piVar83 = (int *)(((long)local_af8.smallend.vect[1] * 4 + (lVar36 - lVar34) * lVar74 * 4 +
                        lVar51 * -4) * lVar35 + (long)local_af8.smallend.vect[0] * 4 + lVar82 * -4 +
                       (long)piVar83);
      lVar78 = lVar74 * lVar35 * 4;
      lVar71 = lVar35 * 4;
      for (; piVar84 = piVar83, lVar89 = (long)local_af8.smallend.vect[1],
          lVar36 <= local_af8.bigend.vect[2]; lVar36 = lVar36 + 1) {
        for (; lVar89 <= local_af8.bigend.vect[1]; lVar89 = lVar89 + 1) {
          piVar96 = piVar84;
          for (lVar103 = (long)local_af8.smallend.vect[0]; lVar103 <= local_af8.bigend.vect[0];
              lVar103 = lVar103 + 1) {
            *piVar96 = 1 - *(int *)((lVar89 - local_3b8.begin.y) *
                                    CONCAT44(local_3b8.jstride._4_4_,(undefined4)local_3b8.jstride)
                                    * 4 + (lVar36 - local_3b8.begin.z) * local_3b8.kstride * 4 +
                                    (long)local_3b8.begin.x * -4 +
                                    CONCAT44(local_3b8.p._4_4_,(int)local_3b8.p) + lVar103 * 4);
            piVar96 = piVar96 + 1;
          }
          piVar84 = piVar84 + lVar35;
        }
        piVar83 = piVar83 + lVar74 * lVar35;
      }
      FArrayBox::resize((FArrayBox *)&rhs.super_BaseFab<double>,&local_af8,1,(Arena *)0x0);
      BaseFab<double>::elixir<double,_0>(&rhseli,&rhs.super_BaseFab<double>);
      pdVar26 = rhs.super_BaseFab<double>.dptr;
      lVar89 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[0];
      local_958 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[1];
      lVar112 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[2];
      lVar36 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[0] -
                      rhs.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      lVar103 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[1] -
                       rhs.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
      local_7b0 = (int)(uVar23 >> 0x20);
      local_7b8 = (int)(uVar22 >> 0x20);
      if (FVar29 == singlevalued) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_7a8,local_838,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_6b0,
                   (FabArray<amrex::FArrayBox> *)
                   local_830._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
        lVar95 = (long)local_af8.smallend.vect[0];
        pdVar90 = (double *)(long)local_af8.smallend.vect[1];
        lVar66 = (long)local_af8.smallend.vect[2];
        lVar94 = (long)pdVar90 * 8;
        local_9b0 = (lVar94 + (lVar66 - lVar112) * lVar103 * 8 + local_958 * -8) * lVar36 +
                    lVar95 * 8 + lVar89 * -8 + (long)pdVar26;
        local_928 = lVar66 + -1;
        lVar99 = lVar44 * 0x10 + lVar66 * 8 + lVar64 * -8;
        lVar75 = (lVar99 + -8) * lVar43 + (long)pdVar90 * 8 + lVar73 * -8;
        local_9b8 = (((lVar75 + -8) * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        lVar37 = ((lVar44 + lVar66) * 8 + lVar64 * -8 + -8) * lVar43 + (long)pdVar90 * 8 +
                 lVar73 * -8;
        local_9c0 = (((lVar37 + -8) * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        lVar44 = lVar94 + (local_928 - lVar64) * lVar43 * 8 + lVar73 * -8;
        local_9c8 = (((lVar44 + -8) * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        lVar99 = lVar99 * lVar43 + (long)pdVar90 * 8 + lVar73 * -8;
        local_9d0 = (((lVar99 + -8) * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        lVar45 = (lVar65 + lVar66 * 8 + lVar64 * -8) * lVar43 + (long)pdVar90 * 8 + lVar73 * -8;
        local_9d8 = (((lVar45 + -8) * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        lVar65 = lVar94 + (lVar66 - lVar64) * lVar43 * 8 + lVar73 * -8;
        local_9e0 = (((lVar65 + -8) * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_9e8 = ((lVar75 * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_9f0 = ((lVar37 * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_938 = ((lVar44 * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_940 = ((lVar99 * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_948 = ((lVar45 * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_950 = ((lVar65 * lVar111 + lVar95 * 8) - local_ad8) + (long)pdVar25;
        local_a50 = ((long)pdVar90 * 4 + (lVar66 - lVar34) * lVar74 * 4 + lVar51 * -4) * lVar35 +
                    lVar95 * 4 + lVar82 * -4 + (long)local_ad0;
        local_910 = (double *)(long)bx.bigend.vect[1];
        lVar44 = lVar95 * 8;
        local_930 = lVar36 * 8;
        for (; lVar66 <= local_af8.bigend.vect[2]; lVar66 = lVar66 + 1) {
          bVar63 = lVar66 == bx.smallend.vect[2] && LVar15 == inflow;
          local_918 = CONCAT71(local_918._1_7_,bVar63);
          bVar28 = lVar66 == bx.bigend.vect[2] && LVar16 == inflow;
          local_920 = CONCAT71(local_920._1_7_,bVar28);
          local_ce8 = local_a50;
          local_b00 = local_950;
          local_b08 = local_948;
          local_b70 = local_940;
          local_ba0 = local_938;
          local_bf8 = (undefined8 *)local_9f0;
          local_ba8 = local_9e8;
          local_b78 = local_9e0;
          local_bc8 = local_9d8;
          local_b30 = local_9d0;
          local_c00 = local_9c8;
          local_b38 = local_9c0;
          local_b10 = local_9b8;
          local_c48 = local_9b0;
          lVar65 = (long)pdVar90 + -1;
          for (pdVar92 = pdVar90; (long)pdVar92 <= (long)local_af8.bigend.vect[1];
              pdVar92 = (double *)((long)pdVar92 + 1)) {
            bVar117 = pdVar92 == (double *)(long)bx.smallend.vect[1] && uVar32 == 0x6a;
            local_6c8 = CONCAT71(local_6c8._1_7_,bVar117);
            bVar118 = pdVar92 == local_910 && uVar33 == 0x6a;
            local_6d0 = CONCAT71(local_6d0._1_7_,bVar118);
            lVar38 = (long)local_6b0.begin.x;
            lVar62 = (local_928 - local_6b0.begin.z) * local_6b0.kstride * 8;
            lVar52 = CONCAT44(local_6b0.jstride._4_4_,(undefined4)local_6b0.jstride) * 8;
            lVar55 = (lVar65 - local_6b0.begin.y) * lVar52;
            lVar94 = lVar55 + lVar62;
            lVar67 = local_6b0.nstride * 0x30;
            lVar104 = local_6b0.nstride * 0x38;
            lVar99 = (lVar66 - local_6b0.begin.z) * local_6b0.kstride * 8;
            lVar55 = lVar55 + lVar99;
            lVar52 = ((long)pdVar92 - (long)local_6b0.begin.y) * lVar52;
            lVar62 = lVar62 + lVar52;
            lVar52 = lVar52 + lVar99;
            lVar46 = local_6b0.nstride * 0x40;
            lVar68 = local_6b0.nstride * 0x10;
            lVar39 = CONCAT44(local_6b0.p._4_4_,local_6b0.p._0_4_) + lVar44;
            lVar99 = lVar67 + lVar94 + lVar38 * -8 + lVar39;
            lVar45 = lVar104 + lVar94 + lVar38 * -8 + lVar39;
            lVar75 = lVar94 + lVar38 * -8 + lVar39;
            lVar37 = lVar46 + lVar94 + lVar38 * -8 + lVar39;
            lVar41 = lVar68 + lVar94 + lVar38 * -8 + lVar39;
            lVar94 = local_6b0.nstride * 8 + lVar94 + lVar38 * -8 + lVar39;
            lVar100 = lVar55 + lVar67 + lVar38 * -8 + lVar39;
            lVar105 = lVar104 + lVar55 + lVar38 * -8 + lVar39;
            lVar56 = lVar55 + lVar38 * -8 + lVar39;
            lVar57 = lVar55 + lVar46 + lVar38 * -8 + lVar39;
            local_8f8 = lVar55 + lVar68 + lVar38 * -8 + lVar39;
            lVar55 = lVar55 + local_6b0.nstride * 8 + lVar38 * -8 + lVar39;
            lVar79 = lVar67 + lVar62 + lVar38 * -8 + lVar39;
            lVar53 = lVar104 + lVar62 + lVar38 * -8 + lVar39;
            local_908 = lVar62 + lVar38 * -8 + lVar39;
            lVar76 = lVar46 + lVar62 + lVar38 * -8 + lVar39;
            local_900 = lVar68 + lVar62 + lVar38 * -8 + lVar39;
            lVar54 = local_6b0.nstride * 8 + lVar62 + lVar38 * -8 + lVar39;
            lVar113 = lVar67 + lVar52 + lVar38 * -8 + lVar39;
            lVar97 = lVar104 + lVar52 + lVar38 * -8 + lVar39;
            lVar91 = lVar52 + lVar38 * -8 + lVar39;
            lVar104 = lVar46 + lVar52 + lVar38 * -8 + lVar39;
            lVar68 = lVar68 + lVar52 + lVar38 * -8 + lVar39;
            lVar39 = lVar52 + local_6b0.nstride * 8 + lVar38 * -8 + lVar39;
            lVar52 = (local_928 - local_7a8.begin.z) * local_7a8.kstride * 8;
            lVar62 = (lVar66 - local_7a8.begin.z) * local_7a8.kstride * 8;
            lVar46 = (lVar65 - local_7a8.begin.y) * local_7a8.jstride * 8;
            lVar77 = ((long)pdVar92 - (long)local_7a8.begin.y) * local_7a8.jstride * 8;
            lVar67 = (long)local_7a8.begin.x;
            lVar38 = lVar52 + lVar46 + lVar67 * -8 + lVar44;
            lVar46 = lVar46 + lVar62 + lVar67 * -8 + lVar44;
            lVar52 = lVar52 + lVar77 + lVar67 * -8 + lVar44;
            lVar62 = lVar77 + lVar62 + lVar67 * -8 + lVar44;
            for (lVar67 = 0; lVar95 + lVar67 <= (long)local_af8.bigend.vect[0]; lVar67 = lVar67 + 1)
            {
              dVar127 = 0.0;
              if (*(int *)(local_ce8 + lVar67 * 4) == 0) {
                dVar127 = 1.0;
                if ((int)local_6b8 == 0x66) {
                  dVar156 = 1.0;
                  if (bx.smallend.vect[0] - lVar95 == lVar67) {
LAB_0061e356:
                    dVar156 = 0.0;
                  }
                }
                else {
                  dVar156 = 1.0;
                  if ((int)local_6b8 == 0x6a && bx.smallend.vect[0] - lVar95 == lVar67)
                  goto LAB_0061e356;
                }
                dVar141 = 1.0;
                if ((((int)local_6c0 == 0x66) || ((int)local_6c0 == 0x6a)) &&
                   (dVar141 = 1.0, bx.bigend.vect[0] - lVar95 == lVar67)) {
                  dVar141 = 0.0;
                }
                if (local_7b0 == 0x66) {
                  dVar145 = dVar127;
                  if (pdVar92 == (double *)(long)bx.smallend.vect[1]) {
LAB_0061e3ce:
                    dVar145 = 0.0;
                  }
                }
                else {
                  dVar145 = 1.0;
                  if (bVar117) goto LAB_0061e3ce;
                }
                if (local_7b8 == 0x66) {
                  dVar148 = dVar127;
                  if (pdVar92 == local_910) {
LAB_0061e402:
                    dVar148 = 0.0;
                  }
                }
                else {
                  dVar148 = 1.0;
                  if (bVar118) goto LAB_0061e402;
                }
                if (LVar15 == Neumann) {
                  if (lVar66 == bx.smallend.vect[2]) {
LAB_0061e436:
                    dVar127 = 0.0;
                  }
                }
                else {
                  dVar127 = 1.0;
                  if (bVar63) goto LAB_0061e436;
                }
                dVar155 = 1.0;
                if (LVar16 == Neumann) {
                  if (lVar66 == bx.bigend.vect[2]) {
LAB_0061e475:
                    dVar155 = 0.0;
                  }
                }
                else if (bVar28) goto LAB_0061e475;
                dVar5 = *(double *)(lVar55 + -8 + lVar67 * 8);
                dVar121 = *(double *)(lVar55 + lVar67 * 8);
                dVar146 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar46 + -8);
                dVar149 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar46);
                dVar131 = *(double *)(local_8f8 + -8 + lVar67 * 8);
                dVar131 = dVar131 + dVar131;
                dVar132 = *(double *)(local_8f8 + lVar67 * 8);
                dVar121 = dVar121 + dVar121;
                dVar132 = dVar132 + dVar132;
                dVar122 = *(double *)(lVar39 + -8 + lVar67 * 8);
                dVar6 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar62 + -8);
                dVar122 = dVar122 + dVar122;
                dVar162 = *(double *)(lVar91 + -8 + lVar67 * 8);
                dVar151 = dVar162 + dVar162 + dVar6;
                dVar162 = *(double *)(lVar68 + -8 + lVar67 * 8);
                dVar162 = dVar162 + dVar162;
                dVar123 = *(double *)(lVar39 + lVar67 * 8) * -2.0;
                dVar7 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar62);
                dVar142 = *(double *)(lVar68 + lVar67 * 8) * -2.0;
                dVar124 = *(double *)(lVar94 + -8 + lVar67 * 8) * -2.0;
                dVar8 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar38 + -8);
                dVar133 = *(double *)(lVar41 + -8 + lVar67 * 8) * -2.0;
                dVar125 = *(double *)(lVar94 + lVar67 * 8);
                dVar125 = dVar125 + dVar125;
                dVar126 = *(double *)(lVar75 + lVar67 * 8);
                dVar9 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar38);
                dVar152 = (dVar126 + dVar126) - dVar9;
                dVar126 = *(double *)(lVar41 + lVar67 * 8);
                dVar126 = dVar126 + dVar126;
                dVar134 = *(double *)(lVar54 + -8 + lVar67 * 8);
                dVar134 = dVar134 + dVar134;
                dVar10 = *(double *)((local_908 - 8) + lVar67 * 8);
                dVar11 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar52 + -8);
                dVar135 = *(double *)(local_900 + -8 + lVar67 * 8);
                dVar135 = dVar135 + dVar135;
                dVar143 = *(double *)(lVar54 + lVar67 * 8);
                dVar143 = dVar143 + dVar143;
                dVar161 = *(double *)(local_908 + lVar67 * 8);
                dVar161 = dVar161 + dVar161;
                dVar12 = *(double *)((long)local_7a8.p + lVar67 * 8 + lVar52);
                dVar160 = *(double *)(local_900 + lVar67 * 8);
                dVar160 = dVar160 + dVar160;
                dVar13 = *(double *)(lVar56 + -8 + lVar67 * 8);
                dVar158 = *(double *)(lVar56 + lVar67 * 8);
                dVar158 = dVar158 + dVar158;
                dVar159 = *(double *)(lVar91 + lVar67 * 8);
                dVar163 = dVar7 - (dVar159 + dVar159);
                dVar159 = *(double *)(lVar75 + -8 + lVar67 * 8) * -2.0 - dVar8;
                dVar127 = ((*(double *)(lVar79 + lVar67 * 8) * -4.0 + (dVar161 - dVar12) + dVar143)
                           * *(double *)(local_ba8 + lVar67 * 8) * dVar141 * dVar148 +
                          (*(double *)(lVar79 + -8 + lVar67 * 8) * 4.0 +
                          (dVar10 * -2.0 - dVar11) + dVar134) *
                          *(double *)(local_ba8 + -8 + lVar67 * 8) * dVar156 * dVar148 +
                          (*(double *)(lVar99 + lVar67 * 8) * 4.0 + (dVar152 - dVar125)) *
                          *(double *)(local_b10 + lVar67 * 8) * dVar141 * dVar145 +
                          (*(double *)(lVar99 + -8 + lVar67 * 8) * -4.0 + dVar159 + dVar124) *
                          *(double *)(local_b10 + -8 + lVar67 * 8) * dVar156 * dVar145 +
                          (*(double *)(lVar113 + lVar67 * 8) * 4.0 + dVar163 + dVar123) *
                          *(double *)(local_b70 + lVar67 * 8) * dVar141 * dVar148 +
                          (*(double *)(lVar113 + -8 + lVar67 * 8) * -4.0 + (dVar151 - dVar122)) *
                          *(double *)(local_b70 + -8 + lVar67 * 8) * dVar156 * dVar148 +
                          (*(double *)(lVar100 + -8 + lVar67 * 8) * 4.0 +
                          dVar5 + dVar5 + dVar13 + dVar13 + dVar146) *
                          *(double *)(local_b30 + -8 + lVar67 * 8) * dVar156 * dVar145 +
                          (*(double *)(lVar100 + lVar67 * 8) * -4.0 + (dVar149 - dVar158) + dVar121)
                          * *(double *)(local_b30 + lVar67 * 8) * dVar141 * dVar145) * dVar4 * 0.25
                          + ((*(double *)(lVar76 + lVar67 * 8) * -4.0 + (dVar12 - dVar143) + dVar160
                             ) * *(double *)(local_ba0 + lVar67 * 8) * dVar148 * dVar127 +
                            (*(double *)(lVar76 + -8 + lVar67 * 8) * 4.0 +
                            ((dVar134 - dVar11) - dVar135)) *
                            *(double *)(local_ba0 + -8 + lVar67 * 8) * dVar148 * dVar127 +
                            (*(double *)(lVar37 + lVar67 * 8) * 4.0 + dVar125 + dVar9 + dVar126) *
                            *(double *)(local_c00 + lVar67 * 8) * dVar145 * dVar127 +
                            (*(double *)(lVar37 + -8 + lVar67 * 8) * -4.0 +
                            (dVar124 - dVar8) + dVar133) * *(double *)(local_c00 + -8 + lVar67 * 8)
                            * dVar145 * dVar127 +
                            (*(double *)(lVar104 + lVar67 * 8) * 4.0 + dVar123 + dVar7 + dVar142) *
                            *(double *)(local_b00 + lVar67 * 8) * dVar148 * dVar155 +
                            (*(double *)(lVar104 + -8 + lVar67 * 8) * -4.0 +
                            (dVar122 - dVar6) + dVar162) * *(double *)(local_b00 + -8 + lVar67 * 8)
                            * dVar148 * dVar155 +
                            (*(double *)(lVar57 + -8 + lVar67 * 8) * 4.0 +
                            (dVar5 * -2.0 - dVar146) + dVar131) *
                            *(double *)(local_b78 + -8 + lVar67 * 8) * dVar145 * dVar155 +
                            (*(double *)(lVar57 + lVar67 * 8) * -4.0 +
                            ((dVar121 + dVar149) - dVar132)) * *(double *)(local_b78 + lVar67 * 8) *
                            dVar145 * dVar155) * dVar2 * 0.25 +
                            ((*(double *)(lVar53 + lVar67 * 8) * -4.0 + (dVar12 - dVar161) + dVar160
                             ) * *(double *)((long)local_bf8 + lVar67 * 8) * dVar141 * dVar127 +
                            (*(double *)(lVar53 + -8 + lVar67 * 8) * 4.0 +
                            dVar10 + dVar10 + dVar11 + dVar135) *
                            *(double *)((long)local_bf8 + -8 + lVar67 * 8) * dVar156 * dVar127 +
                            (*(double *)(lVar45 + lVar67 * 8) * 4.0 + (dVar152 - dVar126)) *
                            *(double *)(local_b38 + lVar67 * 8) * dVar141 * dVar127 +
                            (*(double *)(lVar45 + -8 + lVar67 * 8) * -4.0 + dVar133 + dVar159) *
                            *(double *)(local_b38 + -8 + lVar67 * 8) * dVar156 * dVar127 +
                            (*(double *)(lVar97 + lVar67 * 8) * 4.0 + dVar142 + dVar163) *
                            *(double *)(local_b08 + lVar67 * 8) * dVar141 * dVar155 +
                            (*(double *)(lVar97 + -8 + lVar67 * 8) * -4.0 + (dVar151 - dVar162)) *
                            *(double *)(local_b08 + -8 + lVar67 * 8) * dVar156 * dVar155 +
                            (*(double *)(lVar105 + -8 + lVar67 * 8) * 4.0 +
                            (dVar13 * -2.0 - dVar146) + dVar131) *
                            *(double *)(local_bc8 + -8 + lVar67 * 8) * dVar156 * dVar155 +
                            (*(double *)(lVar105 + lVar67 * 8) * -4.0 +
                            (dVar158 - dVar149) + dVar132) * *(double *)(local_bc8 + lVar67 * 8) *
                            dVar141 * dVar155) * dVar3 * 0.25;
              }
              *(double *)(local_c48 + lVar67 * 8) = dVar127;
            }
            local_c48 = local_c48 + local_930;
            lVar65 = lVar65 + 1;
            local_b10 = local_b10 + lVar47;
            local_b38 = local_b38 + lVar47;
            local_c00 = local_c00 + lVar47;
            local_b30 = local_b30 + lVar47;
            local_bc8 = local_bc8 + lVar47;
            local_b78 = local_b78 + lVar47;
            local_ba8 = local_ba8 + lVar47;
            local_bf8 = (undefined8 *)((long)local_bf8 + lVar47);
            local_ba0 = local_ba0 + lVar47;
            local_b70 = local_b70 + lVar47;
            local_b08 = local_b08 + lVar47;
            local_b00 = local_b00 + lVar47;
            local_ce8 = local_ce8 + lVar71;
          }
          local_9b0 = local_9b0 + lVar103 * lVar36 * 8;
          local_928 = local_928 + 1;
          local_9b8 = local_9b8 + lVar40;
          local_9c0 = local_9c0 + lVar40;
          local_9c8 = local_9c8 + lVar40;
          local_9d0 = local_9d0 + lVar40;
          local_9d8 = local_9d8 + lVar40;
          local_9e0 = local_9e0 + lVar40;
          local_9e8 = local_9e8 + lVar40;
          local_9f0 = local_9f0 + lVar40;
          local_938 = local_938 + lVar40;
          local_940 = local_940 + lVar40;
          local_948 = local_948 + lVar40;
          local_950 = local_950 + lVar40;
          local_a50 = local_a50 + lVar78;
        }
      }
      else {
        lVar55 = (long)local_af8.smallend.vect[0];
        lVar66 = (long)local_af8.smallend.vect[1];
        lVar39 = (long)local_af8.smallend.vect[2];
        uVar30 = ~iVar50;
        uVar110 = ~iVar70;
        lVar99 = lVar66 * 8;
        lVar41 = (lVar99 + (lVar39 - lVar112) * lVar103 * 8 + local_958 * -8) * lVar36 + lVar55 * 8
                 + lVar89 * -8 + (long)rhs.super_BaseFab<double>.dptr;
        lVar37 = (lVar66 * 4 + (lVar39 - lVar34) * lVar74 * 4 + lVar51 * -4) * lVar35 + lVar55 * 4 +
                 lVar82 * -4 + (long)local_ad0;
        lVar38 = (lVar55 * 8 - local_ad8) + (long)pdVar25;
        lVar45 = (lVar44 * 0x10 + lVar39 * 8 + lVar64 * -8) * lVar43;
        lVar95 = (lVar65 + lVar39 * 8 + lVar64 * -8) * lVar43;
        lVar75 = (lVar39 - lVar64) * lVar43;
        local_ba0 = (((lVar45 + lVar66 * 8 + lVar73 * -8) * lVar111 + lVar55 * 8) - local_ad8) +
                    (long)pdVar25;
        local_bf8 = (undefined8 *)
                    ((((lVar95 + lVar66 * 8 + lVar73 * -8) * lVar111 + lVar55 * 8) - local_ad8) +
                    (long)pdVar25);
        local_ba8 = (((lVar99 + lVar75 * 8 + lVar73 * -8) * lVar111 + lVar55 * 8) - local_ad8) +
                    (long)pdVar25;
        lVar99 = lVar99 + lVar73 * -8;
        iVar42 = uVar110 + local_af8.smallend.vect[2];
        local_c30 = lVar38;
        for (; lVar39 <= local_af8.bigend.vect[2]; lVar39 = lVar39 + 1) {
          lVar54 = (long)iVar42;
          lVar53 = (lVar44 * 0x10 + lVar54 * 8) * lVar43;
          lVar104 = (lVar65 + lVar54 * 8) * lVar43;
          lVar54 = lVar54 * lVar43 * 8;
          local_cd8 = (lVar99 + lVar53) * lVar111 + lVar38;
          local_c88 = (lVar104 + lVar99) * lVar111 + lVar38;
          local_c50 = (lVar99 + lVar54) * lVar111 + lVar38;
          lVar56 = (int)(uVar110 + (int)lVar39) * lVar102;
          lVar67 = (lVar39 - lVar64) * lVar102;
          local_c58 = local_ba8;
          local_cb8 = (long)local_bf8;
          local_ca8 = local_ba0;
          lVar46 = lVar41;
          lVar52 = lVar37;
          iVar31 = uVar30 + local_af8.smallend.vect[1];
          for (lVar62 = lVar66; lVar62 <= local_af8.bigend.vect[1]; lVar62 = lVar62 + 1) {
            if (local_af8.smallend.vect[0] <= local_af8.bigend.vect[0]) {
              lVar57 = (long)iVar31;
              lVar68 = (int)(uVar30 + (int)lVar62) * lVar111;
              lVar76 = (lVar62 - lVar73) * lVar111;
              lVar77 = 0;
              do {
                dVar127 = 0.0;
                if (*(int *)(lVar52 + lVar77 * 4) == 0) {
                  if ((int)local_6b8 == 0x66) {
                    dVar127 = 1.0;
                    if (bx.smallend.vect[0] - lVar55 == lVar77) {
LAB_0061f3d5:
                      dVar127 = 0.0;
                    }
                  }
                  else {
                    dVar127 = 1.0;
                    if ((int)local_6b8 == 0x6a && bx.smallend.vect[0] - lVar55 == lVar77)
                    goto LAB_0061f3d5;
                  }
                  if ((((int)local_6c0 == 0x66) || (dVar156 = 1.0, (int)local_6c0 == 0x6a)) &&
                     (dVar156 = 1.0, bx.bigend.vect[0] - lVar55 == lVar77)) {
                    dVar156 = 0.0;
                  }
                  if (local_7b0 == 0x66) {
                    dVar141 = 1.0;
                    if (lVar62 == bx.smallend.vect[1]) {
LAB_0061f426:
                      dVar141 = 0.0;
                    }
                  }
                  else {
                    dVar141 = 1.0;
                    if (lVar62 == bx.smallend.vect[1] && uVar32 == 0x6a) goto LAB_0061f426;
                  }
                  if (local_7b8 == 0x66) {
                    dVar145 = 1.0;
                    if (lVar62 == bx.bigend.vect[1]) {
LAB_0061f452:
                      dVar145 = 0.0;
                    }
                  }
                  else {
                    dVar145 = 1.0;
                    if (lVar62 == bx.bigend.vect[1] && uVar33 == 0x6a) goto LAB_0061f452;
                  }
                  if (LVar15 == Neumann) {
                    dVar148 = 1.0;
                    if (lVar39 == bx.smallend.vect[2]) {
LAB_0061f47e:
                      dVar148 = 0.0;
                    }
                  }
                  else {
                    dVar148 = 1.0;
                    if (lVar39 == bx.smallend.vect[2] && LVar15 == inflow) goto LAB_0061f47e;
                  }
                  dVar155 = 1.0;
                  if (LVar16 == Neumann) {
                    if (lVar39 == bx.bigend.vect[2]) {
LAB_0061f4b1:
                      dVar155 = 0.0;
                    }
                  }
                  else if (lVar39 == bx.bigend.vect[2] && LVar16 == inflow) goto LAB_0061f4b1;
                  lVar79 = (long)(~iVar21 + local_af8.smallend.vect[0] + (int)lVar77);
                  pdVar90 = pdVar25 + lVar68 + lVar79 + lVar56;
                  pdVar92 = pdVar25 + lVar76 + lVar79 + lVar56;
                  pdVar106 = pdVar25 + lVar68 + lVar79 + lVar67;
                  pdVar1 = pdVar25 + lVar76 + lVar79 + lVar67;
                  dVar127 = (dVar156 * *(double *)(local_ca8 + lVar77 * 8) * dVar145 +
                            dVar127 * pdVar1[lVar94 * 2] * dVar145 +
                            *(double *)((lVar45 + lVar57 * 8) * lVar111 + local_c30 + lVar77 * 8) *
                            dVar156 * dVar141 +
                            pdVar106[lVar94 * 2] * dVar127 * dVar141 +
                            (((-pdVar90[lVar94 * 2] * dVar127 * dVar141 -
                              *(double *)((lVar53 + lVar57 * 8) * lVar111 + lVar38 + lVar77 * 8) *
                              dVar156 * dVar141) - pdVar92[lVar94 * 2] * dVar127 * dVar145) -
                            *(double *)(local_cd8 + lVar77 * 8) * dVar156 * dVar145)) * dVar4 * 0.25
                            + (*(double *)(local_c58 + lVar77 * 8) * dVar145 * dVar155 +
                              ((*(double *)
                                 ((lVar75 * 8 + lVar57 * 8) * lVar111 + local_c30 + lVar77 * 8) *
                                dVar141 * dVar155 +
                               ((*(double *)(local_c50 + lVar77 * 8) * dVar145 * dVar148 +
                                ((*(double *)((lVar54 + lVar57 * 8) * lVar111 + lVar38 + lVar77 * 8)
                                  * dVar141 * dVar148 - *pdVar90 * dVar141 * dVar148) -
                                *pdVar92 * dVar145 * dVar148)) - *pdVar106 * dVar141 * dVar155)) -
                              *pdVar1 * dVar145 * dVar155)) * dVar2 * 0.25 +
                              (*(double *)(local_cb8 + lVar77 * 8) * dVar156 * dVar155 +
                              pdVar1[lVar94] * dVar127 * dVar155 +
                              (((*(double *)(local_c88 + lVar77 * 8) * dVar156 * dVar148 +
                                pdVar92[lVar94] * dVar127 * dVar148 +
                                (-pdVar90[lVar94] * dVar127 * dVar148 -
                                *(double *)((lVar104 + lVar57 * 8) * lVar111 + lVar38 + lVar77 * 8)
                                * dVar156 * dVar148)) - pdVar106[lVar94] * dVar127 * dVar155) -
                              *(double *)((lVar95 + lVar57 * 8) * lVar111 + local_c30 + lVar77 * 8)
                              * dVar156 * dVar155)) * dVar3 * 0.25;
                }
                *(double *)(lVar46 + lVar77 * 8) = dVar127;
                lVar77 = lVar77 + 1;
              } while ((local_af8.bigend.vect[0] - local_af8.smallend.vect[0]) + 1 != (int)lVar77);
            }
            lVar46 = lVar46 + lVar36 * 8;
            lVar52 = lVar52 + lVar71;
            iVar31 = iVar31 + 1;
            local_ca8 = local_ca8 + lVar47;
            local_cb8 = local_cb8 + lVar47;
            local_c58 = local_c58 + lVar47;
            local_cd8 = local_cd8 + lVar47;
            local_c88 = local_c88 + lVar47;
            local_c50 = local_c50 + lVar47;
          }
          lVar41 = lVar41 + lVar103 * lVar36 * 8;
          lVar37 = lVar37 + lVar78;
          local_c30 = local_c30 + lVar40;
          iVar42 = iVar42 + 1;
          local_ba0 = local_ba0 + lVar40;
          local_bf8 = (undefined8 *)((long)local_bf8 + lVar40);
          local_ba8 = local_ba8 + lVar40;
        }
      }
      if (rhcc != (MultiFab *)0x0) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_7a8,&rhcc->super_FabArray<amrex::FArrayBox>,&mfi);
        lhs_1.bigend.vect[2] = bx_2.bigend.vect[2];
        lhs_1.btype.itype = bx_2.btype.itype;
        lVar44 = (long)bx_3.smallend.vect[0];
        lhs_1.smallend.vect[0] = bx_2.smallend.vect[0];
        lhs_1.smallend.vect[1] = bx_2.smallend.vect[1];
        if (lhs_1.smallend.vect[0] <= bx_3.smallend.vect[0]) {
          lhs_1.smallend.vect[0] = bx_3.smallend.vect[0];
        }
        lVar65 = (long)bx_3.smallend.vect[1];
        if (lhs_1.smallend.vect[1] <= bx_3.smallend.vect[1]) {
          lhs_1.smallend.vect[1] = bx_3.smallend.vect[1];
        }
        lVar94 = (long)bx_3.smallend.vect[2];
        lhs_1.smallend.vect[2] = bx_2.smallend.vect[2];
        if (bx_2.smallend.vect[2] <= bx_3.smallend.vect[2]) {
          lhs_1.smallend.vect[2] = bx_3.smallend.vect[2];
        }
        lVar99 = (long)bx_3.bigend.vect[0];
        lhs_1.bigend.vect[0] = bx_2.bigend.vect[0];
        if (bx_3.bigend.vect[0] <= bx_2.bigend.vect[0]) {
          lhs_1.bigend.vect[0] = bx_3.bigend.vect[0];
        }
        lVar95 = (long)bx_3.bigend.vect[1];
        lhs_1.bigend.vect[1] = bx_2.bigend.vect[1];
        if (bx_3.bigend.vect[1] <= bx_2.bigend.vect[1]) {
          lhs_1.bigend.vect[1] = bx_3.bigend.vect[1];
        }
        lVar45 = (long)bx_3.bigend.vect[2];
        if (bx_3.bigend.vect[2] <= lhs_1.bigend.vect[2]) {
          lhs_1.bigend.vect[2] = bx_3.bigend.vect[2];
        }
        pdVar90 = (double *)
                  ((((lVar65 * 8 + (lVar94 - lVar64) * lVar43 * 8 + lVar73 * -8) * lVar111 +
                    lVar44 * 8) - local_ad8) + (long)pdVar25);
        for (; pdVar92 = pdVar90, lVar75 = lVar65, lVar94 <= lVar45; lVar94 = lVar94 + 1) {
          for (; lVar37 = lVar44, pdVar106 = pdVar92, lVar75 <= lVar95; lVar75 = lVar75 + 1) {
            for (; lVar37 <= lVar99; lVar37 = lVar37 + 1) {
              local_6b0.p._0_4_ = (undefined4)lVar37;
              local_6b0.p._4_4_ = (undefined4)lVar75;
              local_6b0.jstride._0_4_ = (undefined4)lVar94;
              bVar28 = Box::contains(&lhs_1,(IntVect *)&local_6b0);
              dVar127 = 0.0;
              if (bVar28) {
                dVar127 = local_7a8.p
                          [((lVar94 - local_7a8.begin.z) * local_7a8.kstride +
                           (lVar75 - local_7a8.begin.y) * local_7a8.jstride + lVar37) -
                           (long)local_7a8.begin.x];
              }
              *pdVar106 = dVar127;
              pdVar106 = pdVar106 + 1;
            }
            pdVar92 = pdVar92 + lVar111;
          }
          pdVar90 = pdVar90 + lVar102;
        }
        if (FVar29 == singlevalued) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_6b0,local_838,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_668,
                     (FabArray<amrex::FArrayBox> *)
                     local_830._M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
          lVar37 = (long)local_af8.smallend.vect[0];
          lVar66 = (long)local_af8.smallend.vect[1];
          lVar75 = (long)local_af8.smallend.vect[2];
          local_b90 = lVar75 + -1;
          lVar44 = lVar66 * 8;
          lVar65 = lVar44 + (local_b90 - lVar64) * lVar43 * 8 + lVar73 * -8;
          lVar99 = ((lVar65 * lVar111 + lVar37 * 8) - local_ad8) + (long)pdVar25;
          lVar94 = lVar44 + (lVar75 - lVar64) * lVar43 * 8 + lVar73 * -8;
          lVar95 = ((lVar94 * lVar111 + lVar37 * 8) - local_ad8) + (long)pdVar25;
          lVar45 = (((lVar65 + -8) * lVar111 + lVar37 * 8) - local_ad8) + (long)pdVar25;
          lVar65 = (((lVar94 + -8) * lVar111 + lVar37 * 8) - local_ad8) + (long)pdVar25;
          lVar94 = (lVar66 * 4 + (lVar75 - lVar34) * lVar74 * 4 + lVar51 * -4) * lVar35 + lVar37 * 4
                   + lVar82 * -4 + (long)local_ad0;
          lVar44 = (lVar44 + (lVar75 - lVar112) * lVar103 * 8 + local_958 * -8) * lVar36 +
                   lVar37 * 8 + lVar89 * -8 + (long)pdVar26;
          for (; lVar41 = lVar66 + -1, lVar55 = lVar66, lVar39 = lVar44, local_cf0 = lVar94,
              local_ca0 = (double *)lVar65, local_c80 = lVar95, local_c78 = lVar45,
              local_c10 = lVar99, lVar75 <= local_af8.bigend.vect[2]; lVar75 = lVar75 + 1) {
            for (; lVar55 <= local_af8.bigend.vect[1]; lVar55 = lVar55 + 1) {
              lVar91 = (long)local_668.begin.x;
              lVar105 = (local_b90 - local_668.begin.z) * local_668.kstride * 8;
              lVar100 = CONCAT44(local_668.jstride._4_4_,(undefined4)local_668.jstride) * 8;
              lVar68 = (lVar55 - local_668.begin.y) * lVar100;
              lVar38 = lVar105 + lVar68;
              lVar85 = local_668.nstride * 0x90;
              lVar86 = local_668.nstride * 0x38;
              lVar87 = local_668.nstride * 0x30;
              lVar46 = (lVar75 - local_668.begin.z) * local_668.kstride * 8;
              lVar68 = lVar68 + lVar46;
              lVar100 = (lVar41 - local_668.begin.y) * lVar100;
              lVar105 = lVar105 + lVar100;
              lVar100 = lVar100 + lVar46;
              lVar77 = local_668.nstride * 0x40;
              lVar79 = local_668.nstride * 0x10;
              lVar97 = CONCAT44(local_668.p._4_4_,(int)local_668.p) + lVar37 * 8;
              lVar46 = lVar85 + lVar38 + lVar91 * -8 + lVar97;
              lVar52 = lVar77 + lVar38 + lVar91 * -8 + lVar97;
              lVar62 = lVar38 + lVar86 + lVar91 * -8 + lVar97;
              lVar67 = lVar38 + lVar87 + lVar91 * -8 + lVar97;
              lVar104 = lVar38 + lVar79 + lVar91 * -8 + lVar97;
              lVar53 = local_668.nstride * 8 + lVar38 + lVar91 * -8 + lVar97;
              lVar38 = lVar38 + lVar91 * -8 + lVar97;
              lVar54 = lVar68 + lVar85 + lVar91 * -8 + lVar97;
              lVar56 = lVar68 + lVar77 + lVar91 * -8 + lVar97;
              lVar114 = lVar68 + lVar86 + lVar91 * -8 + lVar97;
              lVar107 = lVar68 + lVar87 + lVar91 * -8 + lVar97;
              lVar93 = lVar68 + lVar79 + lVar91 * -8 + lVar97;
              lVar57 = lVar68 + local_668.nstride * 8 + lVar91 * -8 + lVar97;
              lVar68 = lVar68 + lVar91 * -8 + lVar97;
              lVar88 = lVar105 + lVar85 + lVar91 * -8 + lVar97;
              lVar80 = lVar105 + lVar77 + lVar91 * -8 + lVar97;
              lVar72 = lVar105 + lVar86 + lVar91 * -8 + lVar97;
              lVar69 = lVar87 + lVar105 + lVar91 * -8 + lVar97;
              lVar113 = lVar79 + lVar105 + lVar91 * -8 + lVar97;
              lVar76 = lVar105 + local_668.nstride * 8 + lVar91 * -8 + lVar97;
              lVar101 = lVar105 + lVar91 * -8 + lVar97;
              lVar98 = lVar85 + lVar100 + lVar91 * -8 + lVar97;
              lVar58 = lVar77 + lVar100 + lVar91 * -8 + lVar97;
              lVar77 = lVar86 + lVar100 + lVar91 * -8 + lVar97;
              lVar85 = lVar87 + lVar100 + lVar91 * -8 + lVar97;
              lVar87 = lVar79 + lVar100 + lVar91 * -8 + lVar97;
              lVar79 = lVar100 + local_668.nstride * 8 + lVar91 * -8 + lVar97;
              lVar97 = lVar100 + lVar91 * -8 + lVar97;
              lVar86 = (local_b90 - local_6b0.begin.z) * local_6b0.kstride * 8;
              lVar115 = (lVar75 - local_6b0.begin.z) * local_6b0.kstride * 8;
              lVar91 = CONCAT44(local_6b0.jstride._4_4_,(undefined4)local_6b0.jstride) * 8;
              lVar81 = (lVar55 - local_6b0.begin.y) * lVar91;
              lVar91 = (lVar41 - local_6b0.begin.y) * lVar91;
              lVar116 = (long)local_6b0.begin.x;
              lVar105 = CONCAT44(local_6b0.p._4_4_,local_6b0.p._0_4_) + lVar37 * 8;
              lVar100 = lVar81 + lVar86 + lVar116 * -8 + lVar105;
              lVar81 = lVar81 + lVar115 + lVar116 * -8 + lVar105;
              lVar86 = lVar86 + lVar91 + lVar116 * -8 + lVar105;
              lVar105 = lVar91 + lVar115 + lVar116 * -8 + lVar105;
              for (lVar91 = 0; lVar37 + lVar91 <= (long)local_af8.bigend.vect[0];
                  lVar91 = lVar91 + 1) {
                dVar127 = 0.0;
                if (*(int *)(local_cf0 + lVar91 * 4) == 0) {
                  dVar127 = ((*(double *)(lVar69 + -8 + lVar91 * 8) +
                              *(double *)(lVar72 + -8 + lVar91 * 8) +
                             *(double *)(lVar80 + -8 + lVar91 * 8)) * 0.5 +
                             *(double *)(lVar86 + -8 + lVar91 * 8) * 0.125 +
                             (*(double *)(lVar101 + -8 + lVar91 * 8) +
                              *(double *)(lVar76 + -8 + lVar91 * 8) +
                             *(double *)(lVar113 + -8 + lVar91 * 8)) * 0.25 +
                            *(double *)(lVar88 + -8 + lVar91 * 8)) *
                            *(double *)(local_c78 + -8 + lVar91 * 8) +
                            ((((-*(double *)(lVar69 + lVar91 * 8) - *(double *)(lVar72 + lVar91 * 8)
                               ) + *(double *)(lVar80 + lVar91 * 8)) * 0.5 +
                             *(double *)(lVar86 + lVar91 * 8) * 0.125 +
                             ((*(double *)(lVar76 + lVar91 * 8) - *(double *)(lVar101 + lVar91 * 8))
                             + *(double *)(lVar113 + lVar91 * 8)) * 0.25) -
                            *(double *)(lVar88 + lVar91 * 8)) * *(double *)(local_c78 + lVar91 * 8)
                            + ((((*(double *)(lVar62 + -8 + lVar91 * 8) -
                                 *(double *)(lVar67 + -8 + lVar91 * 8)) -
                                *(double *)(lVar52 + -8 + lVar91 * 8)) * 0.5 +
                               *(double *)(lVar100 + -8 + lVar91 * 8) * 0.125 +
                               ((*(double *)(lVar38 + -8 + lVar91 * 8) -
                                *(double *)(lVar53 + -8 + lVar91 * 8)) +
                               *(double *)(lVar104 + -8 + lVar91 * 8)) * 0.25) -
                              *(double *)(lVar46 + -8 + lVar91 * 8)) *
                              *(double *)(local_c10 + -8 + lVar91 * 8) +
                              (((*(double *)(lVar67 + lVar91 * 8) - *(double *)(lVar62 + lVar91 * 8)
                                ) - *(double *)(lVar52 + lVar91 * 8)) * 0.5 +
                               *(double *)(lVar100 + lVar91 * 8) * 0.125 +
                               ((-*(double *)(lVar38 + lVar91 * 8) -
                                *(double *)(lVar53 + lVar91 * 8)) +
                               *(double *)(lVar104 + lVar91 * 8)) * 0.25 +
                              *(double *)(lVar46 + lVar91 * 8)) *
                              *(double *)(local_c10 + lVar91 * 8) +
                              ((((*(double *)(lVar85 + -8 + lVar91 * 8) -
                                 *(double *)(lVar77 + -8 + lVar91 * 8)) -
                                *(double *)(lVar58 + -8 + lVar91 * 8)) * 0.5 +
                               *(double *)(lVar105 + -8 + lVar91 * 8) * 0.125 +
                               ((*(double *)(lVar97 + -8 + lVar91 * 8) +
                                *(double *)(lVar79 + -8 + lVar91 * 8)) -
                               *(double *)(lVar87 + -8 + lVar91 * 8)) * 0.25) -
                              *(double *)(lVar98 + -8 + lVar91 * 8)) *
                              *(double *)((long)local_ca0 + -8 + lVar91 * 8) +
                              (((*(double *)(lVar77 + lVar91 * 8) - *(double *)(lVar85 + lVar91 * 8)
                                ) - *(double *)(lVar58 + lVar91 * 8)) * 0.5 +
                               *(double *)(lVar105 + lVar91 * 8) * 0.125 +
                               ((*(double *)(lVar79 + lVar91 * 8) - *(double *)(lVar97 + lVar91 * 8)
                                ) - *(double *)(lVar87 + lVar91 * 8)) * 0.25 +
                              *(double *)(lVar98 + lVar91 * 8)) *
                              *(double *)((long)local_ca0 + lVar91 * 8) +
                              (((*(double *)(lVar107 + lVar91 * 8) +
                                 *(double *)(lVar114 + lVar91 * 8) +
                                *(double *)(lVar56 + lVar91 * 8)) * 0.5 +
                               *(double *)(lVar81 + lVar91 * 8) * 0.125 +
                               ((-*(double *)(lVar68 + lVar91 * 8) -
                                *(double *)(lVar57 + lVar91 * 8)) - *(double *)(lVar93 + lVar91 * 8)
                               ) * 0.25) - *(double *)(lVar54 + lVar91 * 8)) *
                              *(double *)(local_c80 + lVar91 * 8) +
                              (((-*(double *)(lVar107 + -8 + lVar91 * 8) -
                                *(double *)(lVar114 + -8 + lVar91 * 8)) +
                               *(double *)(lVar56 + -8 + lVar91 * 8)) * 0.5 +
                               *(double *)(lVar81 + -8 + lVar91 * 8) * 0.125 +
                               ((*(double *)(lVar68 + -8 + lVar91 * 8) -
                                *(double *)(lVar57 + -8 + lVar91 * 8)) -
                               *(double *)(lVar93 + -8 + lVar91 * 8)) * 0.25 +
                              *(double *)(lVar54 + -8 + lVar91 * 8)) *
                              *(double *)(local_c80 + -8 + lVar91 * 8);
                }
                *(double *)(lVar39 + lVar91 * 8) = dVar127 + *(double *)(lVar39 + lVar91 * 8);
              }
              lVar41 = lVar41 + 1;
              local_c10 = local_c10 + lVar47;
              local_c80 = local_c80 + lVar47;
              local_c78 = local_c78 + lVar47;
              local_ca0 = (double *)((long)local_ca0 + lVar47);
              local_cf0 = local_cf0 + lVar71;
              lVar39 = lVar39 + lVar36 * 8;
            }
            local_b90 = local_b90 + 1;
            lVar99 = lVar99 + lVar40;
            lVar95 = lVar95 + lVar40;
            lVar45 = lVar45 + lVar40;
            lVar65 = lVar65 + lVar40;
            lVar94 = lVar94 + lVar78;
            lVar44 = lVar44 + lVar103 * lVar36 * 8;
          }
        }
        else {
          lVar65 = (long)local_af8.smallend.vect[0];
          lVar75 = (long)local_af8.smallend.vect[1];
          lVar94 = (long)local_af8.smallend.vect[2];
          uVar30 = ~iVar50;
          uVar110 = ~iVar70;
          lVar37 = (lVar65 * 8 - local_ad8) + (long)pdVar25;
          lVar95 = (lVar94 - lVar64) * lVar43;
          lVar44 = lVar75 * 8;
          lVar99 = (((lVar44 + lVar95 * 8 + lVar73 * -8) * lVar111 + lVar65 * 8) - local_ad8) +
                   (long)pdVar25;
          lVar45 = (lVar75 * 4 + (lVar94 - lVar34) * lVar74 * 4 + lVar51 * -4) * lVar35 + lVar65 * 4
                   + lVar82 * -4 + (long)local_ad0;
          local_ca8 = (lVar44 + (lVar94 - lVar112) * lVar103 * 8 + local_958 * -8) * lVar36 +
                      lVar65 * 8 + lVar89 * -8 + (long)pdVar26;
          iVar50 = uVar110 + local_af8.smallend.vect[2];
          local_cd8 = lVar37;
          for (; lVar94 <= local_af8.bigend.vect[2]; lVar94 = lVar94 + 1) {
            lVar38 = (long)iVar50 * lVar43 * 8;
            lVar52 = (lVar44 + lVar73 * -8 + lVar38) * lVar111 + lVar37;
            lVar62 = (int)(uVar110 + (int)lVar94) * lVar102;
            lVar46 = (lVar94 - lVar64) * lVar102;
            lVar66 = lVar45;
            lVar55 = lVar99;
            lVar39 = local_ca8;
            iVar70 = uVar30 + local_af8.smallend.vect[1];
            for (lVar41 = lVar75; lVar41 <= local_af8.bigend.vect[1]; lVar41 = lVar41 + 1) {
              lVar67 = (int)((int)lVar41 + uVar30) * lVar111;
              lVar104 = (lVar41 - lVar73) * lVar111;
              for (lVar53 = 0; lVar65 + lVar53 <= (long)local_af8.bigend.vect[0];
                  lVar53 = lVar53 + 1) {
                dVar127 = 0.0;
                if (*(int *)(lVar66 + lVar53 * 4) == 0) {
                  lVar54 = (long)(~iVar21 + local_af8.smallend.vect[0] + (int)lVar53);
                  dVar127 = (pdVar25[lVar67 + lVar54 + lVar62] +
                             *(double *)
                              ((lVar38 + (long)iVar70 * 8) * lVar111 + lVar37 + lVar53 * 8) +
                             pdVar25[lVar104 + lVar54 + lVar62] + *(double *)(lVar52 + lVar53 * 8) +
                             pdVar25[lVar67 + lVar54 + lVar46] +
                             *(double *)
                              ((lVar95 * 8 + (long)iVar70 * 8) * lVar111 + local_cd8 + lVar53 * 8) +
                             pdVar25[lVar104 + lVar54 + lVar46] + *(double *)(lVar55 + lVar53 * 8))
                            * 0.125;
                }
                *(double *)(lVar39 + lVar53 * 8) = dVar127 + *(double *)(lVar39 + lVar53 * 8);
              }
              iVar70 = iVar70 + 1;
              lVar55 = lVar55 + lVar47;
              lVar52 = lVar52 + lVar47;
              lVar66 = lVar66 + lVar71;
              lVar39 = lVar39 + lVar36 * 8;
            }
            local_cd8 = local_cd8 + lVar40;
            iVar50 = iVar50 + 1;
            lVar99 = lVar99 + lVar40;
            lVar45 = lVar45 + lVar78;
            local_ca8 = local_ca8 + lVar103 * lVar36 * 8;
          }
        }
      }
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_7a8,&sync_resid->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_6b0,&phi->super_FabArray<amrex::FArrayBox>,&mfi);
      if (FVar29 == singlevalued) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_668,(FabArray<amrex::FArrayBox> *)*puVar17,&mfi);
        local_708.btype.itype = local_af8.btype.itype;
        local_708.bigend.vect[2] = local_af8.bigend.vect[2];
        local_708.bigend.vect[0] = local_af8.bigend.vect[0];
        local_708.bigend.vect[1] = local_af8.bigend.vect[1];
        lhs_1.smallend.vect[0] = local_af8.smallend.vect[0] + -1;
        lhs_1.smallend.vect[1] = local_af8.smallend.vect[1] + -1;
        lhs_1.smallend.vect[2] = local_af8.smallend.vect[2] + -1;
        lhs_1.bigend.vect[1] = local_af8.bigend.vect[1];
        lhs_1.bigend.vect[2] = local_af8.bigend.vect[2];
        lhs_1.bigend.vect[0] = local_af8.bigend.vect[0];
        for (lVar43 = 0; lVar43 != 3; lVar43 = lVar43 + 1) {
          if ((local_af8.btype.itype >> ((uint)lVar43 & 0x1f) & 1) != 0) {
            piVar83 = lhs_1.bigend.vect + lVar43;
            *piVar83 = *piVar83 + -1;
          }
        }
        lhs_1.btype.itype = 0;
        result.btype.itype = 0;
        result.smallend.vect[2] = local_af8.smallend.vect[2] + -2;
        result.bigend.vect[0] = lhs_1.bigend.vect[0] + 1;
        result.smallend.vect[1] = local_af8.smallend.vect[1] + -2;
        result.smallend.vect[0] = local_af8.smallend.vect[0] + -2;
        result.bigend.vect[1] = lhs_1.bigend.vect[1] + 1;
        result.bigend.vect[2] = lhs_1.bigend.vect[2] + 1;
        local_708.smallend.vect._0_8_ = lhs_1.smallend.vect._0_8_;
        local_708.smallend.vect[2] = lhs_1.smallend.vect[2];
        FArrayBox::resize((FArrayBox *)&sten.super_BaseFab<double>,&local_708,9,(Arena *)0x0);
        BaseFab<double>::elixir<double,_0>(&steneli,&sten.super_BaseFab<double>);
        iVar24 = sten.super_BaseFab<double>.domain.bigend.vect[2];
        iVar31 = sten.super_BaseFab<double>.domain.bigend.vect[1];
        iVar42 = sten.super_BaseFab<double>.domain.bigend.vect[0];
        iVar70 = sten.super_BaseFab<double>.domain.smallend.vect[2];
        iVar50 = sten.super_BaseFab<double>.domain.smallend.vect[1];
        iVar21 = sten.super_BaseFab<double>.domain.smallend.vect[0];
        pdVar90 = sten.super_BaseFab<double>.dptr;
        lVar45 = (long)sten.super_BaseFab<double>.domain.smallend.vect[0];
        lVar43 = (long)sten.super_BaseFab<double>.domain.smallend.vect[1];
        lVar75 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
        FArrayBox::resize((FArrayBox *)&cn.super_BaseFab<double>,&result,0x1c,(Arena *)0x0);
        lVar44 = (long)((iVar42 - iVar21) + 1);
        lVar64 = (long)((iVar31 - iVar50) + 1);
        lVar73 = (long)((iVar24 - iVar70) + 1);
        BaseFab<double>::elixir<double,_0>(&cneli,&cn.super_BaseFab<double>);
        iVar70 = cn.super_BaseFab<double>.domain.smallend.vect[2];
        iVar50 = cn.super_BaseFab<double>.domain.smallend.vect[1];
        iVar21 = cn.super_BaseFab<double>.domain.smallend.vect[0];
        pdVar25 = cn.super_BaseFab<double>.dptr;
        lVar111 = (long)cn.super_BaseFab<double>.domain.smallend.vect[0];
        lVar99 = (long)cn.super_BaseFab<double>.domain.smallend.vect[1];
        lVar95 = (long)cn.super_BaseFab<double>.domain.smallend.vect[2];
        lVar102 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[0] -
                         cn.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
        lVar65 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[1] -
                        cn.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
        lVar47 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[2] -
                        cn.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
        local_930 = lVar65 * lVar102;
        lVar94 = lVar47 * local_930;
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  ((Array4<const_amrex::EBCellFlag> *)&lhs_1,local_6e0,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_8e8,local_838,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_998,
                   (FabArray<amrex::FArrayBox> *)
                   local_830._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
        MFIter::validbox(&local_98,&mfi);
        bx_5.bigend.vect[1] = local_98.bigend.vect[1];
        bx_5.bigend.vect[2] = local_98.bigend.vect[2];
        bx_5.btype.itype = local_98.btype.itype;
        bx_5.smallend.vect[0] = local_98.smallend.vect[0];
        bx_5.smallend.vect[1] = local_98.smallend.vect[1];
        bx_5.smallend.vect[2] = local_98.smallend.vect[2];
        bx_5.bigend.vect[0] = local_98.bigend.vect[0];
        for (lVar40 = 0; lVar40 != 3; lVar40 = lVar40 + 1) {
          if ((bx_5.btype.itype >> ((uint)lVar40 & 0x1f) & 1) != 0) {
            piVar83 = bx_5.bigend.vect + lVar40;
            *piVar83 = *piVar83 + -1;
          }
        }
        iVar31 = result.smallend.vect[0];
        iVar42 = result.smallend.vect[1];
        uVar140 = CONCAT44(-(uint)(local_98.smallend.vect[1] < iVar42),
                           -(uint)(local_98.smallend.vect[0] < iVar31));
        lhs_2.smallend.vect._0_8_ =
             ~uVar140 & local_98.smallend.vect._0_8_ | result.smallend.vect._0_8_ & uVar140;
        lhs_2.smallend.vect[2] = local_98.smallend.vect[2];
        if (local_98.smallend.vect[2] < result.smallend.vect[2]) {
          lhs_2.smallend.vect[2] = result.smallend.vect[2];
        }
        uVar140 = CONCAT44(-(uint)(result.bigend.vect[1] < bx_5.bigend.vect[1]),
                           -(uint)(result.bigend.vect[0] < bx_5.bigend.vect[0]));
        uVar140 = ~uVar140 & CONCAT44(bx_5.bigend.vect[1],bx_5.bigend.vect[0]) |
                  CONCAT44(result.bigend.vect[1],result.bigend.vect[0]) & uVar140;
        lhs_2.bigend.vect[0] = (int)uVar140;
        lhs_2.bigend.vect[1] = (int)(uVar140 >> 0x20);
        lhs_2.bigend.vect[2] = bx_5.bigend.vect[2];
        if (result.bigend.vect[2] < bx_5.bigend.vect[2]) {
          lhs_2.bigend.vect[2] = result.bigend.vect[2];
        }
        lhs_2.btype.itype = result.btype.itype;
        lVar55 = (long)result.smallend.vect[2];
        lVar37 = (long)result.bigend.vect[0];
        lVar66 = (long)result.bigend.vect[1];
        lVar41 = (long)result.bigend.vect[2];
        local_938 = local_930 * 8;
        lVar39 = local_938 * lVar47;
        local_bf8 = (undefined8 *)
                    (((long)iVar42 * 8 + (lVar55 - lVar95) * lVar65 * 8 + lVar99 * -8) * lVar102 +
                     (long)iVar31 * 8 + lVar111 * -8 + (long)pdVar25);
        lVar40 = lVar102 * 8;
        local_6d8 = lVar45;
        for (; iVar24 = local_624.smallend.vect[0], lVar55 <= lVar41; lVar55 = lVar55 + 1) {
          lVar38 = (lVar55 - lVar95) * local_930;
          local_cb0 = (double *)local_bf8;
          for (lVar45 = (long)iVar42; lVar45 <= lVar66; lVar45 = lVar45 + 1) {
            lVar52 = (lVar45 - lVar99) * lVar102;
            pdVar92 = local_cb0;
            lVar46 = (long)iVar31;
            while( true ) {
              if (lVar37 < lVar46) break;
              bx_5.smallend.vect[1] = (int)lVar45;
              bx_5.smallend.vect[0] = (int)lVar46;
              bx_5.smallend.vect[2] = (int)lVar55;
              bVar28 = Box::contains(&lhs_2,&bx_5.smallend);
              if (bVar28) {
                uVar30 = *(uint *)((lVar45 - local_884) *
                                   CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 4 +
                                   lhs_1.smallend.vect._0_8_ + (lVar46 - local_888) * 4 +
                                  (lVar55 - local_880) *
                                  CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]) * 4) & 3;
                if (uVar30 == 0) {
LAB_006222c1:
                  lVar67 = lVar46 - lVar111;
                  lVar62 = 0x1b;
                  puVar48 = pdVar92;
                  while (bVar28 = lVar62 != 0, lVar62 = lVar62 + -1, bVar28) {
                    *puVar48 = 0x3ff0000000000000;
                    puVar48 = (undefined8 *)((long)puVar48 + lVar39);
                  }
                }
                else if (uVar30 == 3) {
                  lVar67 = lVar46 - lVar111;
                  lVar62 = 0x1b;
                  puVar48 = pdVar92;
                  while (bVar28 = lVar62 != 0, lVar62 = lVar62 + -1, bVar28) {
                    *puVar48 = 0;
                    puVar48 = (undefined8 *)((long)puVar48 + lVar39);
                  }
                }
                else {
                  lVar104 = (lVar55 - local_8e8.begin.z) * local_8e8.kstride;
                  lVar62 = (lVar45 - local_8e8.begin.y) *
                           CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                           CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_) +
                           (lVar46 - local_8e8.begin.x) * 8;
                  dVar127 = *(double *)(lVar62 + lVar104 * 8);
                  if (0.9999999999999778 <= dVar127) goto LAB_006222c1;
                  lVar57 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar54 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  lVar53 = lVar46 - local_998.begin.x;
                  lVar67 = lVar46 - lVar111;
                  pdVar25[lVar38 + lVar52 + lVar67] =
                       (((local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 6] -
                         local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 9]) -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xb]) +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 9.0 +
                       dVar127 * 0.5625 +
                       ((-local_998.p[lVar57 + lVar53 + lVar54] -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride]) +
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3] +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 2.25;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94] =
                       (local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xb] -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 18.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 1.125 +
                       ((local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3] -
                        local_998.p[lVar57 + lVar53 + lVar54]) -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 2] =
                       (((local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 9] -
                         local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 6]) -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xb]) +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 9.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 0.5625 +
                       ((local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride] -
                        local_998.p[lVar57 + lVar53 + lVar54]) +
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3] +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 2.25;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 3] =
                       (local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 9] -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 18.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 1.125 +
                       ((-local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride] -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3]) +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 4] =
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf] * 36.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 2.25 +
                       (-local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3] -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 9.0;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 5] =
                       (-local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 9] -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 18.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 1.125 +
                       ((local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride] -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3]) +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 6] =
                       ((-local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 6] -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 9]) +
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xb] +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 9.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 0.5625 +
                       ((local_998.p[lVar57 + lVar53 + lVar54] -
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride]) +
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3] +
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 2.25;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 7] =
                       (-local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xb] -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 0xf]) * 18.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 1.125 +
                       ((local_998.p[lVar57 + lVar53 + lVar54] +
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 3]) -
                       local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride * 4]) * 4.5;
                  lVar56 = lVar46 - local_998.begin.x;
                  lVar76 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar68 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 8] =
                       (local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 6] +
                        local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 9] +
                        local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 0xb] +
                       local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 0xf]) * 9.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 0.5625 +
                       (local_998.p[lVar57 + lVar53 + lVar54] +
                        local_998.p[lVar57 + lVar53 + lVar54 + local_998.nstride] +
                        local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 3] +
                       local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 4]) * 2.25;
                  lVar53 = (lVar55 - local_8e8.begin.z) * local_8e8.kstride;
                  lVar62 = (lVar45 - local_8e8.begin.y) *
                           CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                           CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_) +
                           (lVar46 - local_8e8.begin.x) * 8;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 9] =
                       (((local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 7] -
                         local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 10]) -
                        local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 0xd]) +
                       local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 0x10]) * 9.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 0.5625 +
                       ((-local_998.p[lVar76 + lVar56 + lVar68] -
                        local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 2]) +
                        local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 3] +
                       local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 5]) * 2.25;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 10] =
                       (local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 0xd] -
                       local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 0x10]) * 18.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 1.125 +
                       ((local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 3] -
                        local_998.p[lVar76 + lVar56 + lVar68]) -
                       local_998.p[lVar76 + lVar56 + lVar68 + local_998.nstride * 5]) * 4.5;
                  lVar54 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar56 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  lVar104 = lVar46 - local_998.begin.x;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0xb] =
                       (((local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 10] -
                         local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 7]) -
                        local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 0xd]) +
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 0x10]) * 9.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 0.5625 +
                       ((local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 2] -
                        local_998.p[lVar54 + lVar104 + lVar56]) +
                        local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 3] +
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 5]) * 2.25;
                  lVar53 = (lVar55 - local_8e8.begin.z) * local_8e8.kstride;
                  lVar62 = (lVar45 - local_8e8.begin.y) *
                           CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                           CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_) +
                           (lVar46 - local_8e8.begin.x) * 8;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0xc] =
                       (local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 10] -
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 0x10]) * 18.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 1.125 +
                       ((-local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 2] -
                        local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 3]) +
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 5]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0xd] =
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 0x10] * 36.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 2.25 +
                       (-local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 3] -
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 5]) * 9.0;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0xe] =
                       (-local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 10] -
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 0x10]) * 18.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 1.125 +
                       ((local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 2] -
                        local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 3]) +
                       local_998.p[lVar54 + lVar104 + lVar56 + local_998.nstride * 5]) * 4.5;
                  lVar56 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar54 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  lVar104 = lVar46 - local_998.begin.x;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0xf] =
                       ((-local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 7] -
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 10]) +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 0xd] +
                       local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 0x10]) * 9.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 0.5625 +
                       ((local_998.p[lVar56 + lVar104 + lVar54] -
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 2]) +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 3] +
                       local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 5]) * 2.25;
                  lVar53 = (lVar55 - local_8e8.begin.z) * local_8e8.kstride;
                  lVar62 = (lVar45 - local_8e8.begin.y) *
                           CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                           CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_) +
                           (lVar46 - local_8e8.begin.x) * 8;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x10] =
                       (-local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 0xd] -
                       local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 0x10]) * 18.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 1.125 +
                       ((local_998.p[lVar56 + lVar104 + lVar54] +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 3]) -
                       local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 5]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x11] =
                       (local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 7] +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 10] +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 0xd] +
                       local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 0x10]) * 9.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 0.5625 +
                       (local_998.p[lVar56 + lVar104 + lVar54] +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 2] +
                        local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 3] +
                       local_998.p[lVar56 + lVar104 + lVar54 + local_998.nstride * 5]) * 2.25;
                  lVar104 = lVar46 - local_998.begin.x;
                  lVar54 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar57 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x12] =
                       (((local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 8] -
                         local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0xc]) -
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0xe]) +
                       local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0x11]) * 9.0 +
                       *(double *)(lVar62 + lVar53 * 8) * 0.5625 +
                       ((-local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride] -
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 2]) +
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 4] +
                       local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 5]) * 2.25;
                  lVar62 = (lVar55 - local_8e8.begin.z) * local_8e8.kstride;
                  lVar56 = (lVar46 - local_8e8.begin.x) * 8 +
                           (lVar45 - local_8e8.begin.y) *
                           CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                           CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_);
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x13] =
                       (local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0xe] -
                       local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0x11]) * 18.0 +
                       *(double *)(lVar56 + lVar62 * 8) * 1.125 +
                       ((local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 4] -
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride]) -
                       local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 5]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x14] =
                       (((local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0xc] -
                         local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 8]) -
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0xe]) +
                       local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 0x11]) * 9.0 +
                       *(double *)(lVar56 + lVar62 * 8) * 0.5625 +
                       ((local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 2] -
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride]) +
                        local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 4] +
                       local_998.p[lVar54 + lVar104 + lVar57 + local_998.nstride * 5]) * 2.25;
                  lVar54 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar57 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  lVar53 = lVar46 - local_998.begin.x;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x15] =
                       (local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0xc] -
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0x11]) * 18.0 +
                       *(double *)(lVar56 + lVar62 * 8) * 1.125 +
                       ((-local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 2] -
                        local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 4]) +
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 5]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x16] =
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0x11] * 36.0 +
                       *(double *)(lVar56 + lVar62 * 8) * 2.25 +
                       (-local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 4] -
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 5]) * 9.0;
                  lVar104 = (lVar55 - local_8e8.begin.z) * local_8e8.kstride;
                  lVar62 = (lVar45 - local_8e8.begin.y) *
                           CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                           CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_) +
                           (lVar46 - local_8e8.begin.x) * 8;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x17] =
                       (-local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0xc] -
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0x11]) * 18.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 1.125 +
                       ((local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 2] -
                        local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 4]) +
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 5]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x18] =
                       ((-local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 8] -
                        local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0xc]) +
                        local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0xe] +
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 0x11]) * 9.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 0.5625 +
                       ((local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride] -
                        local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 2]) +
                        local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 4] +
                       local_998.p[lVar54 + lVar53 + lVar57 + local_998.nstride * 5]) * 2.25;
                  lVar54 = (lVar45 - local_998.begin.y) * local_998.jstride;
                  lVar56 = (lVar55 - local_998.begin.z) * local_998.kstride;
                  lVar53 = lVar46 - local_998.begin.x;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x19] =
                       (-local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 0xe] -
                       local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 0x11]) * 18.0 +
                       *(double *)(lVar62 + lVar104 * 8) * 1.125 +
                       ((local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride] +
                        local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 4]) -
                       local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 5]) * 4.5;
                  pdVar25[lVar38 + lVar52 + lVar67 + lVar94 * 0x1a] =
                       (local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 8] +
                        local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 0xc] +
                        local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 0xe] +
                       local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 0x11]) * 9.0 +
                       *(double *)
                        ((lVar45 - local_8e8.begin.y) *
                         CONCAT44(local_8e8.jstride._4_4_,(undefined4)local_8e8.jstride) * 8 +
                         CONCAT44(local_8e8.p._4_4_,local_8e8.p._0_4_) +
                         (lVar46 - local_8e8.begin.x) * 8 +
                        (lVar55 - local_8e8.begin.z) * local_8e8.kstride * 8) * 0.5625 +
                       (local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride] +
                        local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 2] +
                        local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 4] +
                       local_998.p[lVar54 + lVar53 + lVar56 + local_998.nstride * 5]) * 2.25;
                }
                dVar127 = *(double *)
                           ((lVar45 - local_668.begin.y) *
                            CONCAT44(local_668.jstride._4_4_,(undefined4)local_668.jstride) * 8 +
                            CONCAT44(local_668.p._4_4_,(int)local_668.p) +
                            (lVar46 - local_668.begin.x) * 8 +
                           (lVar55 - local_668.begin.z) * local_668.kstride * 8);
              }
              else {
                lVar67 = lVar46 - lVar111;
                lVar62 = 0x1b;
                puVar48 = pdVar92;
                while (bVar28 = lVar62 != 0, lVar62 = lVar62 + -1, bVar28) {
                  *puVar48 = 0;
                  puVar48 = (undefined8 *)((long)puVar48 + lVar39);
                }
                dVar127 = 0.0;
              }
              pdVar25[lVar94 * 0x1b + lVar38 + lVar52 + lVar67] = dVar127;
              lVar46 = lVar46 + 1;
              pdVar92 = pdVar92 + 1;
            }
            local_cb0 = local_cb0 + lVar102;
          }
          local_bf8 = (undefined8 *)((long)local_bf8 + local_938);
        }
        uVar140 = (ulong)local_708.smallend.vect[1];
        lVar46 = (long)local_708.smallend.vect[2];
        lVar66 = uVar140 * 8 + lVar99 * -8;
        lVar41 = (lVar47 * 0xd8 + lVar46 * 8 + lVar95 * -8) * lVar65;
        lVar38 = (lVar47 * 0x68 + lVar46 * 8 + lVar95 * -8) * lVar65;
        lVar55 = (lVar47 * 0x50 + lVar46 * 8 + lVar95 * -8) * lVar65;
        local_928 = (lVar46 * 8 + lVar47 * 0x60 + lVar95 * -8) * lVar65;
        lVar39 = (long)local_708.smallend.vect[0];
        lVar45 = lVar46 * 8;
        lVar37 = lVar46 * 8;
        local_8f8 = lVar94 * 0x16;
        local_948 = ((lVar73 * 8 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8) *
                    lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_940 = lVar64 * lVar44 * 8;
        local_950 = ((lVar73 * 0x10 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8
                    ) * lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_b50 = ((lVar73 * 0x18 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8
                    ) * lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_7f8 = ((lVar73 * 0x20 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8
                    ) * lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_800 = ((lVar73 * 0x28 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8
                    ) * lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_808 = ((lVar73 * 0x30 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8
                    ) * lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_810 = ((lVar73 * 0x38 + lVar46 * 8 + lVar75 * -8) * lVar64 + uVar140 * 8 + lVar43 * -8
                    ) * lVar44 + lVar39 * 8 + local_6d8 * -8 + (long)pdVar90;
        pdVar92 = pdVar25 + (lVar39 - lVar111);
        local_b48 = (lVar41 + uVar140 * 8 + lVar99 * -8) * lVar102 + lVar39 * 8 + lVar111 * -8 +
                    (long)pdVar25;
        local_c08 = ((lVar47 * 0x48 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_a48 = ((lVar47 * 0x90 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_a50 = ((lVar47 * 0xb0 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9b0 = (lVar38 + uVar140 * 8 + lVar99 * -8) * lVar102 + lVar39 * 8 + lVar111 * -8 +
                    (long)pdVar25;
        local_9b8 = ((lVar47 * 0x20 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9c0 = (uVar140 * 8 + (lVar46 - lVar95) * lVar65 * 8 + lVar99 * -8) * lVar102 +
                    lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9c8 = (lVar55 + uVar140 * 8 + lVar99 * -8) * lVar102 + lVar39 * 8 + lVar111 * -8 +
                    (long)pdVar25;
        local_9d0 = ((lVar47 * 0x98 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9d8 = ((lVar47 * 8 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8) *
                    lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9e0 = ((lVar47 * 0xa8 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9e8 = ((lVar47 * 0x18 + lVar46 * 8 + lVar95 * -8) * lVar65 + uVar140 * 8 + lVar99 * -8
                    ) * lVar102 + lVar39 * 8 + lVar111 * -8 + (long)pdVar25;
        local_9f0 = lVar39 * 8 + (local_928 + uVar140 * 8 + lVar99 * -8) * lVar102 + lVar111 * -8 +
                    (long)pdVar25;
        local_918 = (lVar47 * 0x10 + lVar46 * 8 + lVar95 * -8) * lVar65;
        local_920 = (lVar47 * 0xc0 + lVar46 * 8 + lVar95 * -8) * lVar65;
        lVar111 = lVar44 * 8;
        iVar42 = ~iVar70 + local_708.smallend.vect[2];
        local_66c = ~iVar50 + local_708.smallend.vect[1];
        local_910 = pdVar92;
        for (; lVar46 <= local_708.bigend.vect[2]; lVar46 = lVar46 + 1) {
          local_ad8 = CONCAT44(local_ad8._4_4_,iVar42);
          lVar52 = (long)iVar42;
          local_6c8 = (lVar47 * 0xd8 + lVar52 * 8) * lVar65;
          local_ca0 = (double *)((lVar66 + local_6c8) * lVar102 + (long)pdVar92);
          local_cd0 = (double *)
                      (((lVar47 * 0x58 + lVar52 * 8) * lVar65 + lVar66) * lVar102 + (long)pdVar92);
          local_cc8 = (double *)
                      (((lVar47 * 0xa0 + lVar52 * 8) * lVar65 + lVar66) * lVar102 + (long)pdVar92);
          local_cc0 = (double *)
                      (((lVar47 * 0x20 + lVar52 * 8) * lVar65 + lVar66) * lVar102 + (long)pdVar92);
          local_c90 = (double *)
                      (((lVar47 * 8 + lVar52 * 8) * lVar65 + lVar66) * lVar102 + (long)pdVar92);
          local_c98 = (double *)
                      (((lVar47 * 0xb8 + lVar52 * 8) * lVar65 + lVar66) * lVar102 + (long)pdVar92);
          local_c70 = (double *)
                      (((lVar47 * 0x18 + lVar52 * 8) * lVar65 + lVar66) * lVar102 + (long)pdVar92);
          local_6d0 = (lVar47 * 0x70 + lVar52 * 8) * lVar65;
          local_cb0 = (double *)((lVar66 + local_6d0) * lVar102 + (long)pdVar92);
          lVar67 = (lVar46 - lVar95) * local_930;
          lVar62 = (~iVar70 + (int)lVar46) * local_930;
          local_cf0 = local_9f0;
          local_cf8 = local_9e8;
          local_c80 = local_9e0;
          local_ce8 = local_9d8;
          local_c10 = local_9d0;
          local_bd8 = local_9c8;
          local_bb0 = local_9c0;
          local_c18 = local_9b8;
          local_bb8 = local_9b0;
          local_b68 = local_a50;
          local_b60 = local_a48;
          local_b88 = local_c08;
          local_bf0 = local_b48;
          local_c20 = local_810;
          local_c28 = local_808;
          local_be0 = local_800;
          local_c60 = local_7f8;
          local_be8 = local_b50;
          local_c30 = local_950;
          local_bc0 = local_948;
          uVar27 = uVar140;
          iVar31 = local_66c;
          while (uVar49 = uVar27, (long)uVar49 <= (long)local_708.bigend.vect[1]) {
            lVar68 = (long)iVar31;
            lVar104 = (lVar41 + lVar68 * 8) * lVar102;
            lVar53 = ((lVar47 * 200 + lVar45 + lVar95 * -8) * lVar65 + lVar68 * 8) * lVar102;
            lVar54 = ((lVar47 * 0x28 + lVar37 + lVar95 * -8) * lVar65 + lVar68 * 8) * lVar102;
            lVar56 = (uVar49 - lVar99) * lVar102;
            lVar57 = (~iVar50 + (int)uVar49) * lVar102;
            for (lVar76 = 0; lVar39 + lVar76 <= (long)local_708.bigend.vect[0]; lVar76 = lVar76 + 1)
            {
              *(double *)(local_bc0 + lVar76 * 8) =
                   (*(double *)
                     ((long)pdVar92 +
                     lVar76 * 8 + ((lVar47 * 0x28 + lVar52 * 8) * lVar65 + lVar68 * 8) * lVar102) *
                    dVar154 +
                   *(double *)
                    ((long)pdVar92 +
                    lVar76 * 8 + ((lVar47 * 0xd0 + lVar52 * 8) * lVar65 + lVar68 * 8) * lVar102) *
                   dVar119 + *(double *)
                              ((long)pdVar92 + lVar76 * 8 + (local_6d0 + lVar68 * 8) * lVar102) *
                             dVar138) *
                   *(double *)((long)pdVar92 + lVar76 * 8 + (local_6c8 + lVar68 * 8) * lVar102) +
                   (local_c70[lVar76] * dVar154 +
                   local_cc8[lVar76] * dVar119 + local_cb0[lVar76] * dVar138) * local_ca0[lVar76] +
                   (*(double *)(local_cf8 + lVar76 * 8) * dVar154 +
                   *(double *)(local_b60 + lVar76 * 8) * dVar119 +
                   *(double *)(local_cf0 + lVar76 * 8) * dVar138) *
                   *(double *)(local_bf0 + lVar76 * 8) +
                   (*(double *)((long)local_910 + lVar76 * 8 + lVar54) * dVar154 +
                   *(double *)((long)local_910 + lVar76 * 8 + (local_920 + lVar68 * 8) * lVar102) *
                   dVar119 + *(double *)
                              ((long)local_910 + lVar76 * 8 + (local_928 + lVar68 * 8) * lVar102) *
                             dVar138) * *(double *)((long)local_910 + lVar76 * 8 + lVar104);
              lVar77 = (long)(~iVar21 + local_708.smallend.vect[0] + (int)lVar76);
              *(double *)(local_c30 + lVar76 * 8) =
                   (pdVar25[lVar56 + lVar77 + lVar62 + lVar94 * 7] * dVar154 +
                   pdVar25[lVar56 + lVar77 + lVar62 + lVar94 * 0x17] * dVar157 +
                   pdVar25[lVar56 + lVar77 + lVar62 + lVar94 * 0x11] * dVar150) *
                   pdVar25[lVar94 * 0x1b + lVar56 + lVar77 + lVar62] +
                   (local_c90[lVar76] * dVar154 +
                   local_c98[lVar76] * dVar157 + local_cd0[lVar76] * dVar150) * local_ca0[lVar76] +
                   (*(double *)(local_ce8 + lVar76 * 8) * dVar154 +
                   *(double *)(local_c80 + lVar76 * 8) * dVar157 +
                   *(double *)(local_b88 + lVar76 * 8) * dVar150) *
                   *(double *)(local_bf0 + lVar76 * 8) +
                   (pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 7] * dVar154 +
                   pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 0x15] * dVar157 +
                   pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 0xf] * dVar150) *
                   pdVar25[lVar94 * 0x1b + lVar56 + lVar77 + lVar67];
              *(double *)(local_be8 + lVar76 * 8) =
                   (pdVar25[lVar57 + lVar67 + lVar77 + lVar94 * 8] * dVar139 +
                   pdVar25[lVar57 + lVar67 + lVar77 + lVar94 * 0x19] * dVar157 +
                   pdVar25[lVar57 + lVar67 + lVar77 + lVar94 * 0x10] * dVar138) *
                   pdVar25[lVar94 * 0x1b + lVar57 + lVar67 + lVar77] +
                   (*(double *)((long)local_910 + lVar76 * 8 + (local_918 + lVar68 * 8) * lVar102) *
                    dVar139 +
                   *(double *)((long)local_910 + lVar76 * 8 + lVar53) * dVar157 +
                   *(double *)((long)local_910 + lVar76 * 8 + (lVar55 + lVar68 * 8) * lVar102) *
                   dVar138) * *(double *)((long)local_910 + lVar76 * 8 + lVar104) +
                   (*(double *)(local_bb0 + lVar76 * 8) * dVar139 +
                   *(double *)(local_c10 + lVar76 * 8) * dVar157 +
                   *(double *)(local_bd8 + lVar76 * 8) * dVar138) *
                   *(double *)(local_bf0 + lVar76 * 8) +
                   (pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 6] * dVar139 +
                   pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 0x13] * dVar157 +
                   pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 0x10] * dVar138) *
                   pdVar25[lVar94 * 0x1b + lVar56 + lVar77 + lVar67];
              *(double *)(local_c60 + lVar76 * 8) =
                   (*(double *)(local_c18 + lVar76 * 8) * -dVar130 +
                   *(double *)(local_c80 + lVar76 * 8) * dVar137 +
                   *(double *)(local_cf0 + lVar76 * 8) * dVar147) *
                   *(double *)(local_bf0 + lVar76 * 8) +
                   (local_cc0[lVar76] * -dVar130 +
                   local_c98[lVar76] * dVar137 + local_cb0[lVar76] * dVar147) * local_ca0[lVar76];
              *(double *)(local_be0 + lVar76 * 8) =
                   (*(double *)(local_cf8 + lVar76 * 8) * dVar153 +
                   *(double *)(local_c10 + lVar76 * 8) * dVar137 +
                   *(double *)(local_bb8 + lVar76 * 8) * -dVar144) *
                   *(double *)(local_bf0 + lVar76 * 8) +
                   (*(double *)((long)local_910 + lVar76 * 8 + lVar54) * dVar153 +
                   *(double *)((long)local_910 + lVar76 * 8 + lVar53) * dVar137 +
                   *(double *)((long)local_910 + lVar76 * 8 + (lVar38 + lVar68 * 8) * lVar102) *
                   -dVar144) * *(double *)((long)local_910 + lVar76 * 8 + lVar104);
              *(double *)(local_c28 + lVar76 * 8) =
                   (*(double *)(local_ce8 + lVar76 * 8) * dVar153 +
                   *(double *)(local_b68 + lVar76 * 8) * -dVar136 +
                   *(double *)(local_bd8 + lVar76 * 8) * dVar147) *
                   *(double *)(local_bf0 + lVar76 * 8) +
                   (pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 7] * dVar153 +
                   pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 0x16] * -dVar136 +
                   pdVar25[lVar56 + lVar77 + lVar67 + lVar94 * 0x10] * dVar147) *
                   pdVar25[lVar94 * 0x1b + lVar56 + lVar77 + lVar67];
              *(double *)(local_c20 + lVar76 * 8) =
                   (*(double *)(local_c18 + lVar76 * 8) * dVar130 +
                   *(double *)(local_b68 + lVar76 * 8) * dVar136 +
                   *(double *)(local_bb8 + lVar76 * 8) * dVar144) *
                   *(double *)(local_bf0 + lVar76 * 8);
            }
            local_bc0 = local_bc0 + lVar111;
            local_c30 = local_c30 + lVar111;
            local_be8 = local_be8 + lVar111;
            local_c60 = local_c60 + lVar111;
            local_be0 = local_be0 + lVar111;
            local_c28 = local_c28 + lVar111;
            local_c20 = local_c20 + lVar111;
            local_ca0 = local_ca0 + lVar102;
            local_bf0 = local_bf0 + lVar40;
            local_cd0 = local_cd0 + lVar102;
            local_cc8 = local_cc8 + lVar102;
            local_cc0 = local_cc0 + lVar102;
            local_c90 = local_c90 + lVar102;
            local_c98 = local_c98 + lVar102;
            local_c70 = local_c70 + lVar102;
            local_cb0 = local_cb0 + lVar102;
            local_b88 = local_b88 + lVar40;
            local_b60 = local_b60 + lVar40;
            local_b68 = local_b68 + lVar40;
            local_bb8 = local_bb8 + lVar40;
            local_c18 = local_c18 + lVar40;
            local_bb0 = local_bb0 + lVar40;
            local_bd8 = local_bd8 + lVar40;
            local_c10 = local_c10 + lVar40;
            local_ce8 = local_ce8 + lVar40;
            local_c80 = local_c80 + lVar40;
            local_cf8 = local_cf8 + lVar40;
            local_cf0 = local_cf0 + lVar40;
            iVar31 = iVar31 + 1;
            local_908 = uVar49;
            uVar27 = uVar49 + 1;
          }
          local_948 = local_948 + local_940;
          local_950 = local_950 + local_940;
          local_b50 = local_b50 + local_940;
          local_7f8 = local_7f8 + local_940;
          local_800 = local_800 + local_940;
          local_808 = local_808 + local_940;
          local_810 = local_810 + local_940;
          iVar42 = iVar42 + 1;
          local_b48 = local_b48 + local_938;
          local_c08 = local_c08 + local_938;
          local_a48 = local_a48 + local_938;
          local_a50 = local_a50 + local_938;
          local_9b0 = local_9b0 + local_938;
          local_9b8 = local_9b8 + local_938;
          local_9c0 = local_9c0 + local_938;
          local_9c8 = local_9c8 + local_938;
          local_9d0 = local_9d0 + local_938;
          local_9d8 = local_9d8 + local_938;
          local_9e0 = local_9e0 + local_938;
          local_9e8 = local_9e8 + local_938;
          local_9f0 = local_9f0 + local_938;
          local_910 = (double *)((long)local_910 + local_938);
        }
        local_cf0 = (long)local_624.smallend.vect[2];
        lVar102 = (long)local_624.smallend.vect[1];
        lVar94 = (long)local_624.smallend.vect[0];
        local_b28 = (long)pdVar26 +
                    (lVar102 * 8 + (local_cf0 - lVar112) * lVar103 * 8 + local_958 * -8) * lVar36 +
                    lVar94 * 8 + lVar89 * -8;
        local_ad0 = (int *)((long)local_ad0 +
                           (lVar102 * 4 + (local_cf0 - lVar34) * lVar74 * 4 + lVar51 * -4) * lVar35
                           + lVar94 * 4 + lVar82 * -4);
        lVar65 = lVar73 * 0x38 + local_cf0 * 8 + lVar75 * -8;
        lVar40 = lVar73 * 0x30 + local_cf0 * 8 + lVar75 * -8;
        lVar47 = lVar73 * 0x28 + local_cf0 * 8 + lVar75 * -8;
        lVar74 = lVar73 * 0x18 + local_cf0 * 8 + lVar75 * -8;
        lVar35 = (lVar65 + -8) * lVar64 + lVar102 * 8 + lVar43 * -8;
        lVar34 = (lVar40 + -8) * lVar64 + lVar102 * 8 + lVar43 * -8;
        lVar82 = lVar65 * lVar64 + lVar102 * 8 + lVar43 * -8;
        lVar40 = lVar40 * lVar64 + lVar102 * 8 + lVar43 * -8;
        lVar51 = lVar102 * 8 + (lVar73 * 0x20 + local_cf0 * 8 + lVar75 * -8) * lVar64 + lVar43 * -8;
        lVar65 = (lVar73 * 0x10 + local_cf0 * 8 + lVar75 * -8) * lVar64 + lVar102 * 8 + lVar43 * -8;
        local_c10 = lVar35 * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_b30 = lVar94 * 8 + lVar34 * lVar44 + local_6d8 * -8 + (long)pdVar90;
        local_b70 = ((lVar47 + -8) * lVar64 + lVar102 * 8 + lVar43 * -8) * lVar44 + lVar94 * 8 +
                    local_6d8 * -8 + (long)pdVar90;
        local_ba0 = ((lVar74 + -8) * lVar64 + lVar102 * 8 + lVar43 * -8) * lVar44 + lVar94 * 8 +
                    local_6d8 * -8 + (long)pdVar90;
        local_bf8 = (undefined8 *)
                    (((lVar73 * 0x40 + local_cf0 * 8 + lVar75 * -8) * lVar64 + lVar102 * 8 +
                     lVar43 * -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90);
        local_ba8 = (lVar102 * 8 + (local_cf0 - lVar75) * lVar64 * 8 + lVar43 * -8) * lVar44 +
                    lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_b78 = lVar82 * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_bc8 = lVar40 * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_c00 = (lVar47 * lVar64 + lVar102 * 8 + lVar43 * -8) * lVar44 + lVar94 * 8 +
                    local_6d8 * -8 + (long)pdVar90;
        local_b38 = lVar51 * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_b10 = (lVar74 * lVar64 + lVar102 * 8 + lVar43 * -8) * lVar44 + lVar94 * 8 +
                    local_6d8 * -8 + (long)pdVar90;
        local_b18 = lVar65 * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_a60 = ((lVar73 * 8 + local_cf0 * 8 + lVar75 * -8) * lVar64 + lVar102 * 8 + lVar43 * -8
                    ) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_a68 = (lVar35 + -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_a70 = (lVar34 + -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_a78 = (lVar82 + -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_a80 = (lVar40 + -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        local_9a0 = (lVar51 + -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        lVar43 = (lVar65 + -8) * lVar44 + lVar94 * 8 + local_6d8 * -8 + (long)pdVar90;
        lVar44 = (long)local_624.bigend.vect[0];
        lVar64 = (long)local_624.bigend.vect[1];
        lVar73 = (long)local_624.bigend.vect[2];
        local_b90 = local_cf0 + -1;
        local_900 = lVar102 + -1;
        local_908 = CONCAT44(local_908._4_4_,local_624.smallend.vect[1] + 1);
        local_6d8 = local_6d8 * 8;
        iVar21 = local_624.smallend.vect[2];
        while (iVar21 = iVar21 + 1, local_cf0 <= lVar73) {
          local_ca8 = local_9a0;
          local_cf8 = local_a80;
          local_c68 = local_a78;
          local_ce8 = local_a70;
          local_cd0 = (double *)local_a68;
          local_cc8 = (double *)local_a60;
          local_cc0 = (double *)local_b18;
          local_c90 = (double *)local_b10;
          local_c98 = (double *)local_b38;
          local_c70 = (double *)local_c00;
          local_c48 = local_bc8;
          local_cb0 = (double *)local_b78;
          local_ca0 = (double *)local_ba8;
          local_bb8 = (long)local_bf8;
          local_c78 = local_ba0;
          local_c80 = local_b70;
          local_ce0 = local_b30;
          local_bd8 = (long)local_ad0;
          local_be8 = local_908 & 0xffffffff;
          local_c30 = local_900;
          local_c18 = local_b28;
          lVar65 = lVar102;
          local_cb8 = lVar43;
          local_8f8 = local_c10;
          while (lVar65 <= lVar64) {
            lVar40 = 0;
            while( true ) {
              if (lVar44 < lVar94 + lVar40) break;
              bx_5.smallend.vect[1] = (int)lVar65;
              bx_5.smallend.vect[0] = iVar24 + (int)lVar40;
              bx_5.smallend.vect[2] = (int)local_cf0;
              bVar28 = Box::contains(&local_af8,&bx_5.smallend);
              if (bVar28) {
                *(double *)((long)local_ca0 + lVar40 * 8) =
                     -(*(double *)((long)local_cc8 + -8 + lVar40 * 8) +
                       *(double *)((long)local_cc8 + lVar40 * 8) +
                       *(double *)(local_cb8 + lVar40 * 8) +
                       *(double *)((long)local_cc0 + lVar40 * 8) +
                       *(double *)(local_c78 + lVar40 * 8) +
                       *(double *)((long)local_c90 + lVar40 * 8) +
                       *(double *)(local_ca8 + -8 + lVar40 * 8) +
                       *(double *)(local_ca8 + lVar40 * 8) +
                       *(double *)((long)local_c98 + -8 + lVar40 * 8) +
                       *(double *)((long)local_c98 + lVar40 * 8) +
                       *(double *)(local_c80 + -8 + lVar40 * 8) +
                       *(double *)(local_c80 + lVar40 * 8) +
                       *(double *)((long)local_c70 + -8 + lVar40 * 8) +
                       *(double *)((long)local_c70 + lVar40 * 8) +
                       *(double *)(local_ce8 + lVar40 * 8) + *(double *)(local_ce0 + lVar40 * 8) +
                       *(double *)(local_cf8 + lVar40 * 8) + *(double *)(local_c48 + lVar40 * 8) +
                       *(double *)((long)local_cd0 + -8 + lVar40 * 8) +
                       *(double *)((long)local_cd0 + lVar40 * 8) +
                       *(double *)(local_c10 + -8 + lVar40 * 8) +
                       *(double *)(local_c10 + lVar40 * 8) +
                       *(double *)(local_c68 + -8 + lVar40 * 8) +
                       *(double *)(local_c68 + lVar40 * 8) +
                       *(double *)((long)local_cb0 + -8 + lVar40 * 8) +
                      *(double *)((long)local_cb0 + lVar40 * 8));
                *(double *)(local_bb8 + lVar40 * 8) =
                     1.0 / (ABS(*(double *)((long)local_cb0 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_cb0 + -8 + lVar40 * 8)) +
                            ABS(*(double *)(local_c68 + lVar40 * 8)) +
                            ABS(*(double *)(local_c68 + -8 + lVar40 * 8)) +
                            ABS(*(double *)(local_c10 + lVar40 * 8)) +
                            ABS(*(double *)(local_c10 + -8 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_cd0 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_cd0 + -8 + lVar40 * 8)) +
                            ABS(*(double *)(local_c48 + lVar40 * 8)) +
                            ABS(*(double *)(local_cf8 + lVar40 * 8)) +
                            ABS(*(double *)(local_ce0 + lVar40 * 8)) +
                            ABS(*(double *)(local_ce8 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_c70 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_c70 + -8 + lVar40 * 8)) +
                            ABS(*(double *)(local_c80 + lVar40 * 8)) +
                            ABS(*(double *)(local_c80 + -8 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_c98 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_c98 + -8 + lVar40 * 8)) +
                            ABS(*(double *)(local_ca8 + lVar40 * 8)) +
                            ABS(*(double *)(local_ca8 + -8 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_c90 + lVar40 * 8)) +
                            ABS(*(double *)(local_c78 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_cc0 + lVar40 * 8)) +
                            ABS(*(double *)(local_cb8 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_cc8 + lVar40 * 8)) +
                            ABS(*(double *)((long)local_cc8 + -8 + lVar40 * 8)) + 1e-100);
                dVar127 = 0.0;
                if (*(int *)(local_bd8 + lVar40 * 4) == 0) {
                  lVar75 = (long)local_6b0.begin.x;
                  lVar35 = (long)local_6b0.begin.y;
                  lVar89 = CONCAT44(local_6b0.jstride._4_4_,(undefined4)local_6b0.jstride);
                  lVar74 = lVar89 * 8;
                  lVar112 = (long)local_6b0.begin.z;
                  lVar82 = local_6b0.kstride * 8;
                  lVar41 = ((local_cf0 + -1) - lVar112) * local_6b0.kstride;
                  lVar99 = ((int)(local_cf0 + 1) - local_6b0.begin.z) * local_6b0.kstride;
                  lVar38 = local_6b0.kstride * (local_cf0 - lVar112);
                  lVar34 = (local_cf0 - lVar112) * lVar82;
                  lVar45 = (lVar65 - lVar35) * lVar74;
                  lVar51 = CONCAT44(local_6b0.p._4_4_,local_6b0.p._0_4_);
                  lVar47 = lVar51 + lVar94 * 8;
                  lVar66 = lVar45 + lVar34 + lVar75 * -8 + lVar47;
                  lVar39 = (local_c30 - lVar35) * lVar74;
                  lVar95 = lVar39 + lVar34 + lVar75 * -8 + lVar47;
                  lVar74 = ((int)local_be8 - local_6b0.begin.y) * lVar74;
                  lVar37 = lVar34 + lVar74 + lVar75 * -8 + lVar47;
                  lVar55 = (long)(((iVar24 + (int)lVar40) - local_6b0.begin.x) + 1);
                  lVar34 = lVar51 + lVar89 * (lVar65 - lVar35) * 8 + lVar55 * 8;
                  lVar35 = lVar51 + ((lVar65 + -1) - lVar35) * lVar89 * 8 + lVar55 * 8;
                  lVar51 = lVar51 + ((int)(lVar65 + 1) - local_6b0.begin.y) * lVar89 * 8 +
                           lVar55 * 8;
                  lVar55 = (local_b90 - lVar112) * lVar82;
                  lVar89 = lVar55 + lVar45 + lVar75 * -8 + lVar47;
                  lVar82 = (iVar21 - local_6b0.begin.z) * lVar82;
                  lVar112 = lVar45 + lVar82 + lVar75 * -8 + lVar47;
                  lVar45 = lVar55 + lVar39 + lVar75 * -8 + lVar47;
                  lVar55 = lVar55 + lVar74 + lVar75 * -8 + lVar47;
                  lVar39 = lVar39 + lVar82 + lVar75 * -8 + lVar47;
                  lVar47 = lVar82 + lVar74 + lVar75 * -8 + lVar47;
                  dVar127 = *(double *)(lVar51 + lVar99 * 8) *
                            *(double *)((long)local_cb0 + lVar40 * 8) +
                            *(double *)(lVar47 + -8 + lVar40 * 8) *
                            *(double *)((long)local_cb0 + -8 + lVar40 * 8) +
                            *(double *)(lVar35 + lVar99 * 8) * *(double *)(local_c68 + lVar40 * 8) +
                            *(double *)(lVar39 + -8 + lVar40 * 8) *
                            *(double *)(local_c68 + -8 + lVar40 * 8) +
                            *(double *)(lVar51 + lVar41 * 8) * *(double *)(local_c10 + lVar40 * 8) +
                            *(double *)(lVar55 + -8 + lVar40 * 8) *
                            *(double *)(local_c10 + -8 + lVar40 * 8) +
                            *(double *)(lVar35 + lVar41 * 8) *
                            *(double *)((long)local_cd0 + lVar40 * 8) +
                            *(double *)(lVar45 + -8 + lVar40 * 8) *
                            *(double *)((long)local_cd0 + -8 + lVar40 * 8) +
                            *(double *)(lVar47 + lVar40 * 8) * *(double *)(local_c48 + lVar40 * 8) +
                            *(double *)(lVar39 + lVar40 * 8) * *(double *)(local_cf8 + lVar40 * 8) +
                            *(double *)(lVar55 + lVar40 * 8) * *(double *)(local_ce0 + lVar40 * 8) +
                            *(double *)(lVar45 + lVar40 * 8) * *(double *)(local_ce8 + lVar40 * 8) +
                            *(double *)(lVar34 + lVar99 * 8) *
                            *(double *)((long)local_c70 + lVar40 * 8) +
                            *(double *)(lVar112 + -8 + lVar40 * 8) *
                            *(double *)((long)local_c70 + -8 + lVar40 * 8) +
                            *(double *)(lVar34 + lVar41 * 8) * *(double *)(local_c80 + lVar40 * 8) +
                            *(double *)(lVar89 + -8 + lVar40 * 8) *
                            *(double *)(local_c80 + -8 + lVar40 * 8) +
                            *(double *)(lVar51 + lVar38 * 8) *
                            *(double *)((long)local_c98 + lVar40 * 8) +
                            *(double *)(lVar37 + -8 + lVar40 * 8) *
                            *(double *)((long)local_c98 + -8 + lVar40 * 8) +
                            *(double *)(lVar35 + lVar38 * 8) * *(double *)(local_ca8 + lVar40 * 8) +
                            *(double *)(lVar95 + -8 + lVar40 * 8) *
                            *(double *)(local_ca8 + -8 + lVar40 * 8) +
                            *(double *)(lVar112 + lVar40 * 8) *
                            *(double *)((long)local_c90 + lVar40 * 8) +
                            *(double *)(lVar89 + lVar40 * 8) * *(double *)(local_c78 + lVar40 * 8) +
                            *(double *)(lVar37 + lVar40 * 8) *
                            *(double *)((long)local_cc0 + lVar40 * 8) +
                            *(double *)(lVar95 + lVar40 * 8) * *(double *)(local_cb8 + lVar40 * 8) +
                            *(double *)(lVar34 + lVar38 * 8) *
                            *(double *)((long)local_cc8 + lVar40 * 8) +
                            *(double *)(lVar66 + lVar40 * 8) *
                            *(double *)((long)local_ca0 + lVar40 * 8) +
                            *(double *)(lVar66 + -8 + lVar40 * 8) *
                            *(double *)((long)local_cc8 + -8 + lVar40 * 8);
                }
                lVar34 = (local_cf0 - local_7a8.begin.z) * local_7a8.kstride;
                lVar47 = (lVar65 - local_7a8.begin.y) * local_7a8.jstride;
                local_7a8.p[(lVar34 + lVar47 + lVar94 + lVar40) - (long)local_7a8.begin.x] = dVar127
                ;
                local_7a8.p[(lVar34 + lVar47 + lVar94 + lVar40) - (long)local_7a8.begin.x] =
                     *(double *)(local_c18 + lVar40 * 8) - dVar127;
              }
              else {
                local_7a8.p
                [((local_cf0 - local_7a8.begin.z) * local_7a8.kstride +
                 (lVar65 - local_7a8.begin.y) * local_7a8.jstride + lVar94 + lVar40) -
                 (long)local_7a8.begin.x] = 0.0;
              }
              lVar40 = lVar40 + 1;
            }
            local_c18 = local_c18 + lVar36 * 8;
            local_c30 = local_c30 + 1;
            local_be8 = (ulong)((int)local_be8 + 1);
            local_bd8 = local_bd8 + lVar71;
            local_c10 = local_c10 + lVar111;
            local_ce0 = local_ce0 + lVar111;
            local_c80 = local_c80 + lVar111;
            local_c78 = local_c78 + lVar111;
            local_bb8 = local_bb8 + lVar111;
            local_ca0 = (double *)((long)local_ca0 + lVar111);
            local_cb0 = (double *)((long)local_cb0 + lVar111);
            local_c48 = local_c48 + lVar111;
            local_c70 = (double *)((long)local_c70 + lVar111);
            local_c98 = (double *)((long)local_c98 + lVar111);
            local_c90 = (double *)((long)local_c90 + lVar111);
            local_cc0 = (double *)((long)local_cc0 + lVar111);
            local_cc8 = (double *)((long)local_cc8 + lVar111);
            local_cd0 = (double *)((long)local_cd0 + lVar111);
            local_ce8 = local_ce8 + lVar111;
            local_c68 = local_c68 + lVar111;
            local_cf8 = local_cf8 + lVar111;
            local_ca8 = local_ca8 + lVar111;
            local_cb8 = local_cb8 + lVar111;
            lVar65 = lVar65 + 1;
          }
          local_b28 = local_b28 + lVar103 * lVar36 * 8;
          local_b90 = local_b90 + 1;
          local_ad0 = (int *)((long)local_ad0 + lVar78);
          local_c10 = local_8f8 + local_940;
          local_b30 = local_b30 + local_940;
          local_b70 = local_b70 + local_940;
          local_ba0 = local_ba0 + local_940;
          local_bf8 = (undefined8 *)((long)local_bf8 + local_940);
          local_ba8 = local_ba8 + local_940;
          local_b78 = local_b78 + local_940;
          local_bc8 = local_bc8 + local_940;
          local_c00 = local_c00 + local_940;
          local_b38 = local_b38 + local_940;
          local_b10 = local_b10 + local_940;
          local_b18 = local_b18 + local_940;
          local_a60 = local_a60 + local_940;
          local_a68 = local_a68 + local_940;
          local_a70 = local_a70 + local_940;
          local_a78 = local_a78 + local_940;
          local_a80 = local_a80 + local_940;
          local_9a0 = local_9a0 + local_940;
          lVar43 = lVar43 + local_940;
          local_cf0 = local_cf0 + 1;
        }
        Gpu::Elixir::~Elixir(&cneli);
        Gpu::Elixir::~Elixir(&steneli);
      }
      else {
        lhs_1.bigend.vect[2] = bx_2.bigend.vect[2];
        lhs_1.btype.itype = bx_2.btype.itype;
        lVar44 = (long)bx_3.smallend.vect[0];
        lhs_1.smallend.vect[0] = bx_2.smallend.vect[0];
        lhs_1.smallend.vect[1] = bx_2.smallend.vect[1];
        if (lhs_1.smallend.vect[0] <= bx_3.smallend.vect[0]) {
          lhs_1.smallend.vect[0] = bx_3.smallend.vect[0];
        }
        lVar65 = (long)bx_3.smallend.vect[1];
        if (lhs_1.smallend.vect[1] <= bx_3.smallend.vect[1]) {
          lhs_1.smallend.vect[1] = bx_3.smallend.vect[1];
        }
        lVar94 = (long)bx_3.smallend.vect[2];
        if (bx_2.smallend.vect[2] <= bx_3.smallend.vect[2]) {
          bx_2.smallend.vect[2] = bx_3.smallend.vect[2];
        }
        lVar99 = (long)bx_3.bigend.vect[0];
        if (bx_3.bigend.vect[0] <= bx_2.bigend.vect[0]) {
          bx_2.bigend.vect[0] = bx_3.bigend.vect[0];
        }
        lVar95 = (long)bx_3.bigend.vect[1];
        if (bx_3.bigend.vect[1] <= bx_2.bigend.vect[1]) {
          bx_2.bigend.vect[1] = bx_3.bigend.vect[1];
        }
        lVar45 = (long)bx_3.bigend.vect[2];
        if (bx_3.bigend.vect[2] <= lhs_1.bigend.vect[2]) {
          lhs_1.bigend.vect[2] = bx_3.bigend.vect[2];
        }
        this_02 = (FabArray<amrex::FArrayBox> *)*puVar17;
        lhs_1.smallend.vect[2] = bx_2.smallend.vect[2];
        lhs_1.bigend.vect[0] = bx_2.bigend.vect[0];
        lhs_1.bigend.vect[1] = bx_2.bigend.vect[1];
        if (this_02 == (FabArray<amrex::FArrayBox> *)0x0) {
          RVar14 = this->m_const_sigma;
          pRVar60 = (Real *)((((lVar65 * 8 + (lVar94 - lVar64) * lVar43 * 8 + lVar73 * -8) * lVar111
                              + lVar44 * 8) - local_ad8) + (long)pdVar25);
          for (; pRVar61 = pRVar60, lVar75 = lVar65, lVar94 <= lVar45; lVar94 = lVar94 + 1) {
            for (; lVar37 = lVar44, pRVar109 = pRVar61, lVar75 <= lVar95; lVar75 = lVar75 + 1) {
              for (; lVar37 <= lVar99; lVar37 = lVar37 + 1) {
                local_668.p._0_4_ = (int)lVar37;
                local_668.p._4_4_ = (undefined4)lVar75;
                local_668.jstride._0_4_ = (undefined4)lVar94;
                bVar28 = Box::contains(&lhs_1,(IntVect *)&local_668);
                RVar129 = RVar14;
                if (!bVar28) {
                  RVar129 = 0.0;
                }
                *pRVar109 = RVar129;
                pRVar109 = pRVar109 + 1;
              }
              pRVar61 = pRVar61 + lVar111;
            }
            pRVar60 = pRVar60 + lVar102;
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_668,this_02,&mfi);
          lVar99 = (long)bx_3.smallend.vect[0];
          lVar94 = (long)bx_3.smallend.vect[1];
          lVar45 = (long)bx_3.smallend.vect[2];
          lVar95 = (long)bx_3.bigend.vect[0];
          lVar44 = (long)bx_3.bigend.vect[1];
          lVar65 = (long)bx_3.bigend.vect[2];
          puVar48 = (undefined8 *)
                    ((((lVar94 * 8 + (lVar45 - lVar64) * lVar43 * 8 + lVar73 * -8) * lVar111 +
                      lVar99 * 8) - local_ad8) + (long)pdVar25);
          for (; puVar59 = puVar48, lVar75 = lVar94, lVar45 <= lVar65; lVar45 = lVar45 + 1) {
            for (; lVar37 = lVar99, puVar108 = puVar59, lVar75 <= lVar44; lVar75 = lVar75 + 1) {
              for (; lVar37 <= lVar95; lVar37 = lVar37 + 1) {
                local_8e8.p._0_4_ = (undefined4)lVar37;
                local_8e8.p._4_4_ = (undefined4)lVar75;
                local_8e8.jstride._0_4_ = (undefined4)lVar45;
                bVar28 = Box::contains(&lhs_1,(IntVect *)&local_8e8);
                uVar128 = 0;
                if (bVar28) {
                  uVar128 = *(undefined8 *)
                             ((lVar75 - local_668.begin.y) *
                              CONCAT44(local_668.jstride._4_4_,(undefined4)local_668.jstride) * 8 +
                              (lVar45 - local_668.begin.z) * local_668.kstride * 8 +
                              (long)local_668.begin.x * -8 +
                              CONCAT44(local_668.p._4_4_,(int)local_668.p) + lVar37 * 8);
                }
                *puVar108 = uVar128;
                puVar108 = puVar108 + 1;
              }
              puVar59 = puVar59 + lVar111;
            }
            puVar48 = puVar48 + lVar102;
          }
        }
        iVar70 = local_624.smallend.vect[1];
        iVar50 = local_624.smallend.vect[0];
        lVar65 = (long)local_624.smallend.vect[2];
        local_bd8 = lVar65 + -1;
        lVar102 = (long)local_624.smallend.vect[1];
        lVar44 = lVar102 * 8;
        lVar94 = lVar44 + (lVar65 - lVar64) * lVar43 * 8 + lVar73 * -8;
        lVar43 = lVar44 + (local_bd8 - lVar64) * lVar43 * 8 + lVar73 * -8;
        lVar64 = (long)local_624.smallend.vect[0];
        local_c20 = (((lVar94 + -8) * lVar111 + lVar64 * 8) - local_ad8) + (long)pdVar25;
        local_c28 = (((lVar43 + -8) * lVar111 + lVar64 * 8) - local_ad8) + (long)pdVar25;
        local_be0 = ((lVar94 * lVar111 + lVar64 * 8) - local_ad8) + (long)pdVar25;
        local_c60 = ((lVar43 * lVar111 + lVar64 * 8) - local_ad8) + (long)pdVar25;
        local_b28 = (long)pdVar26 +
                    (lVar44 + (lVar65 - lVar112) * lVar103 * 8 + local_958 * -8) * lVar36 +
                    lVar64 * 8 + lVar89 * -8;
        lVar73 = (long)local_624.bigend.vect[0];
        lVar43 = (long)local_624.bigend.vect[1];
        lVar44 = (long)local_624.bigend.vect[2];
        local_ad0 = (int *)((long)local_ad0 +
                           (lVar102 * 4 + (lVar65 - lVar34) * lVar74 * 4 + lVar51 * -4) * lVar35 +
                           lVar64 * 4 + lVar82 * -4);
        iVar21 = local_624.smallend.vect[2];
        while (iVar21 = iVar21 + 1, lVar65 <= lVar44) {
          local_ce0 = (long)local_ad0;
          local_cd8 = local_b28;
          local_cb0 = (double *)local_c60;
          local_ca0 = (double *)local_be0;
          local_c78 = local_c28;
          local_c80 = local_c20;
          lVar34 = lVar102;
          local_c98 = (double *)(lVar102 + -1);
          iVar42 = iVar70;
          while (iVar42 = iVar42 + 1, lVar34 <= lVar43) {
            for (lVar35 = 0; lVar64 + lVar35 <= lVar73; lVar35 = lVar35 + 1) {
              local_668.p._0_4_ = iVar50 + (int)lVar35;
              local_668.p._4_4_ = (undefined4)lVar34;
              local_668.jstride._0_4_ = (undefined4)lVar65;
              bVar28 = Box::contains(&local_af8,(IntVect *)&local_668);
              if (bVar28) {
                dVar127 = 0.0;
                if (*(int *)(local_ce0 + lVar35 * 4) == 0) {
                  lVar62 = (long)local_6b0.begin.x;
                  lVar39 = (long)local_6b0.begin.y;
                  lVar89 = CONCAT44(local_6b0.p._4_4_,local_6b0.p._0_4_);
                  lVar112 = CONCAT44(local_6b0.jstride._4_4_,(undefined4)local_6b0.jstride);
                  lVar94 = lVar112 * 8;
                  lVar51 = (long)local_6b0.begin.z;
                  lVar46 = (lVar34 - lVar39) * lVar94;
                  lVar41 = ((long)local_c98 - lVar39) * lVar94;
                  lVar94 = (iVar42 - local_6b0.begin.y) * lVar94;
                  lVar111 = local_6b0.kstride * 8;
                  lVar66 = ((lVar65 + -1) - lVar51) * local_6b0.kstride;
                  lVar38 = ((int)(lVar65 + 1) - local_6b0.begin.z) * local_6b0.kstride;
                  lVar67 = local_6b0.kstride * (lVar65 - lVar51);
                  lVar99 = (lVar65 - lVar51) * lVar111;
                  lVar52 = (local_bd8 - lVar51) * lVar111;
                  lVar111 = (iVar21 - local_6b0.begin.z) * lVar111;
                  lVar51 = lVar89 + lVar64 * 8;
                  lVar95 = lVar52 + lVar94 + lVar62 * -8 + lVar51;
                  lVar45 = lVar52 + lVar41 + lVar62 * -8 + lVar51;
                  lVar104 = lVar99 + lVar46 + lVar62 * -8 + lVar51;
                  dVar127 = *(double *)(local_c78 + -8 + lVar35 * 8);
                  dVar156 = *(double *)(local_c78 + lVar35 * 8);
                  dVar149 = dVar127 + dVar156;
                  dVar141 = *(double *)((long)local_cb0 + -8 + lVar35 * 8);
                  dVar145 = *(double *)((long)local_cb0 + lVar35 * 8);
                  dVar146 = dVar149 + dVar141 + dVar145;
                  dVar148 = *(double *)(local_c80 + -8 + lVar35 * 8);
                  dVar155 = *(double *)(local_c80 + lVar35 * 8);
                  dVar5 = *(double *)((long)local_ca0 + -8 + lVar35 * 8);
                  dVar121 = *(double *)((long)local_ca0 + lVar35 * 8);
                  lVar55 = (long)(((iVar50 + (int)lVar35) - local_6b0.begin.x) + 1);
                  lVar74 = lVar89 + ((lVar34 + -1) - lVar39) * lVar112 * 8 + lVar55 * 8;
                  lVar82 = lVar89 + ((int)(lVar34 + 1) - local_6b0.begin.y) * lVar112 * 8 +
                           lVar55 * 8;
                  lVar75 = lVar41 + lVar111 + lVar62 * -8 + lVar51;
                  lVar37 = lVar111 + lVar94 + lVar62 * -8 + lVar51;
                  lVar52 = lVar52 + lVar46 + lVar62 * -8 + lVar51;
                  lVar89 = lVar89 + lVar112 * (lVar34 - lVar39) * 8 + lVar55 * 8;
                  lVar112 = lVar111 + lVar46 + lVar62 * -8 + lVar51;
                  lVar111 = lVar41 + lVar99 + lVar62 * -8 + lVar51;
                  lVar51 = lVar94 + lVar99 + lVar62 * -8 + lVar51;
                  dVar127 = (dVar146 * *(double *)(lVar52 + lVar35 * 8) +
                            (dVar148 + dVar155 + dVar5 + dVar121) *
                            *(double *)(lVar112 + lVar35 * 8)) * ((dVar157 - dVar147) + dVar139) +
                            ((dVar149 + dVar148 + dVar155) * *(double *)(lVar111 + lVar35 * 8) +
                            (dVar141 + dVar145 + dVar5 + dVar121) * *(double *)(lVar51 + lVar35 * 8)
                            ) * (dVar157 + dVar150 + dVar130 * -2.0) +
                            ((dVar127 + dVar141 + dVar148 + dVar5) *
                             *(double *)(lVar104 + -8 + lVar35 * 8) +
                            (dVar156 + dVar145 + dVar155 + dVar121) *
                            *(double *)(lVar89 + lVar67 * 8)) *
                            ((dVar119 - dVar147) + dVar130 * -2.0) +
                            ((dVar145 + dVar121) * *(double *)(lVar82 + lVar67 * 8) +
                            (dVar141 + dVar5) * *(double *)(lVar51 + -8 + lVar35 * 8) +
                            (dVar127 + dVar148) * *(double *)(lVar111 + -8 + lVar35 * 8) +
                            (dVar156 + dVar155) * *(double *)(lVar74 + lVar67 * 8)) *
                            ((dVar137 + dVar147) - dVar130) +
                            ((dVar155 + dVar121) * *(double *)(lVar89 + lVar38 * 8) +
                            (dVar148 + dVar5) * *(double *)(lVar112 + -8 + lVar35 * 8) +
                            *(double *)(lVar52 + -8 + lVar35 * 8) * (dVar127 + dVar141) +
                            *(double *)(lVar89 + lVar66 * 8) * (dVar156 + dVar145)) *
                            ((dVar137 - dVar144) + dVar153) +
                            ((dVar5 + dVar121) * *(double *)(lVar37 + lVar35 * 8) +
                            *(double *)(lVar75 + lVar35 * 8) * (dVar148 + dVar155) +
                            *(double *)(lVar45 + lVar35 * 8) * dVar149 +
                            *(double *)(lVar95 + lVar35 * 8) * (dVar141 + dVar145)) *
                            ((dVar147 - dVar136) + dVar153) +
                            (*(double *)(lVar82 + lVar38 * 8) * dVar121 +
                            *(double *)(lVar37 + -8 + lVar35 * 8) * dVar5 +
                            *(double *)(lVar74 + lVar38 * 8) * dVar155 +
                            *(double *)(lVar75 + -8 + lVar35 * 8) * dVar148 +
                            *(double *)(lVar82 + lVar66 * 8) * dVar145 +
                            *(double *)(lVar95 + -8 + lVar35 * 8) * dVar141 +
                            *(double *)(lVar45 + -8 + lVar35 * 8) * dVar127 +
                            *(double *)(lVar74 + lVar66 * 8) * dVar156) * dVar120 +
                            (dVar146 + dVar148 + dVar155 + dVar5 + dVar121) *
                            *(double *)(lVar104 + lVar35 * 8) * -4.0 * dVar120;
                }
                lVar74 = (lVar65 - local_7a8.begin.z) * local_7a8.kstride;
                lVar51 = (lVar34 - local_7a8.begin.y) * local_7a8.jstride;
                local_7a8.p[(lVar74 + lVar51 + lVar64 + lVar35) - (long)local_7a8.begin.x] = dVar127
                ;
                local_7a8.p[(lVar74 + lVar51 + lVar64 + lVar35) - (long)local_7a8.begin.x] =
                     *(double *)(local_cd8 + lVar35 * 8) - dVar127;
              }
              else {
                local_7a8.p
                [((lVar65 - local_7a8.begin.z) * local_7a8.kstride +
                 (lVar34 - local_7a8.begin.y) * local_7a8.jstride + lVar64 + lVar35) -
                 (long)local_7a8.begin.x] = 0.0;
              }
            }
            local_c80 = local_c80 + lVar47;
            local_c78 = local_c78 + lVar47;
            local_ca0 = (double *)((long)local_ca0 + lVar47);
            local_cb0 = (double *)((long)local_cb0 + lVar47);
            local_cd8 = local_cd8 + lVar36 * 8;
            local_ce0 = local_ce0 + lVar71;
            local_c98 = (double *)((long)local_c98 + 1);
            lVar34 = lVar34 + 1;
          }
          local_c20 = local_c20 + lVar40;
          local_c28 = local_c28 + lVar40;
          local_be0 = local_be0 + lVar40;
          local_c60 = local_c60 + lVar40;
          local_b28 = local_b28 + lVar103 * lVar36 * 8;
          local_ad0 = (int *)((long)local_ad0 + lVar78);
          local_bd8 = local_bd8 + 1;
          lVar65 = lVar65 + 1;
        }
      }
      Gpu::Elixir::~Elixir(&rhseli);
      Gpu::Elixir::~Elixir(&tmeli);
      Gpu::Elixir::~Elixir(&ueli);
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLNodeLaplacian::compSyncResidualFine (MultiFab& sync_resid, const MultiFab& phi, const MultiFab& vold,
                                       const MultiFab* rhcc)
{
    BL_PROFILE("MLNodeLaplacian::SyncResFine()");

    const auto& sigma_orig = m_sigma[0][0][0];
    const iMultiFab& dmsk = *m_dirichlet_mask[0][0];

    const auto lobc = LoBC();
    const auto hibc = HiBC();

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[0][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* intg = m_integral[0].get();
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

    const Geometry& geom = m_geom[0][0];
    const Box& ccdom = geom.Domain();
    const Box& nddom = amrex::surroundingNodes(ccdom);
    const auto dxinv = geom.InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox rhs, u;
        IArrayBox tmpmask;
#ifdef AMREX_USE_EB
        FArrayBox sten, cn;
#endif
        for (MFIter mfi(sync_resid,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();

            auto typ = FabType::regular;
#ifdef AMREX_USE_EB
            if (factory) {
                typ = (*flags)[mfi].getType(amrex::enclosedCells(bx));
            }
#endif
            if (typ != FabType::covered)
            {
                const Box& gbx = mfi.growntilebox();
                const Box& vbx = mfi.validbox();
                const Box& ccvbx = amrex::enclosedCells(vbx);
                const Box& bxg1 = amrex::grow(bx,1);
                const Box& ccbxg1 = amrex::enclosedCells(bxg1);

                u.resize(ccbxg1, AMREX_SPACEDIM);
                Elixir ueli = u.elixir();
                Array4<Real> const& uarr = u.array();

                Box ovlp = ccvbx & ccbxg1;
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                {
                    if (m_lobc[0][idim] == LinOpBCType::inflow)
                    {
                        if (ovlp.smallEnd(idim) == ccdom.smallEnd(idim)) {
                            ovlp.growLo(idim, 1);
                        }
                    }
                    if (m_hibc[0][idim] == LinOpBCType::inflow)
                    {
                        if (ovlp.bigEnd(idim) == ccdom.bigEnd(idim)) {
                            ovlp.growHi(idim, 1);
                        }
                    }
                }

                Array4<Real const> const& voarr = vold.const_array(mfi);
                AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                {
                    if (ovlp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                        AMREX_D_TERM(uarr(i,j,k,0) = voarr(i,j,k,0);,
                                     uarr(i,j,k,1) = voarr(i,j,k,1);,
                                     uarr(i,j,k,2) = voarr(i,j,k,2););
                    } else {
                        AMREX_D_TERM(uarr(i,j,k,0) = 0.0;,
                                     uarr(i,j,k,1) = 0.0;,
                                     uarr(i,j,k,2) = 0.0;);
                    }
                });

                tmpmask.resize(bx);
                Elixir tmeli = tmpmask.elixir();
                Array4<int> const& tmpmaskarr = tmpmask.array();
                Array4<int const> const& dmskarr = dmsk.const_array(mfi);
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    tmpmaskarr(i,j,k) = 1-dmskarr(i,j,k);
                });

                rhs.resize(bx);
                Elixir rhseli = rhs.elixir();
                Array4<Real> const& rhsarr = rhs.array();

#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_divu_eb(i,j,k,rhsarr,uarr,vfracarr,intgarr,tmpmaskarr,dxinv,nddom,lobc,hibc);
                    });
                }
                else
#endif
                {
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_divu(i,j,k,rhsarr,uarr,tmpmaskarr,dxinv,nddom,lobc,hibc,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_divu(i,j,k,rhsarr,uarr,tmpmaskarr,dxinv,nddom,lobc,hibc);
                    });
#endif
                }

                if (rhcc)
                {
                    Array4<Real> rhccarr = uarr;
                    Array4<Real const> const& rhccarr_orig = rhcc->const_array(mfi);
                    const Box& ovlp3 = ccvbx & ccbxg1;
                    AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                    {
                        if (ovlp3.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            rhccarr(i,j,k) = rhccarr_orig(i,j,k);
                        } else {
                            rhccarr(i,j,k) = 0.0;
                        }
                    });
#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            Real rhs2 = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,tmpmaskarr);
                            rhsarr(i,j,k) += rhs2;
                        });
                    }
                    else
#endif
                    {
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            Real rhs2 = mlndlap_rhcc(i,j,k,rhccarr,tmpmaskarr);
                            rhsarr(i,j,k) += rhs2;
                        });
                    }
                }

                Array4<Real> const& sync_resid_a = sync_resid.array(mfi);
                Array4<Real const> const& phiarr = phi.const_array(mfi);
#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);

                    Box stbx = bx;
                    AMREX_D_TERM(stbx.growLo(0,1);, stbx.growLo(1,1);, stbx.growLo(2,1));
                    Box const& sgbx = amrex::grow(amrex::enclosedCells(stbx),1);

                    constexpr int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
                    sten.resize(stbx,ncomp_s);
                    Elixir steneli = sten.elixir();
                    Array4<Real> const& stenarr = sten.array();

                    constexpr int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                    cn.resize(sgbx,ncomp_c+1);
                    Elixir cneli = cn.elixir();
                    Array4<Real> const& cnarr = cn.array();
                    Array4<Real> const& sgarr = cn.array(ncomp_c);

                    Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);

                    const Box& ibx = sgbx & amrex::enclosedCells(mfi.validbox());
                    AMREX_HOST_DEVICE_FOR_3D(sgbx, i, j, k,
                    {
                        if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                            sgarr(i,j,k) = sigmaarr_orig(i,j,k);
                        } else {
                            for (int n = 0; n < ncomp_c; ++n) {
                                cnarr(i,j,k,n) = 0.0;
                            }
                            sgarr(i,j,k) = 0.0;
                        }
                    });

                    AMREX_HOST_DEVICE_FOR_3D(stbx, i, j, k,
                    {
                        mlndlap_set_stencil_eb(i, j, k, stenarr, sgarr, cnarr, dxinv);
                    });

                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            mlndlap_set_stencil_s0(i, j, k, stenarr);
                            sync_resid_a(i,j,k) = mlndlap_adotx_sten(i,j,k, phiarr, stenarr, tmpmaskarr);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
                }
                else
#endif
                {
                    Array4<Real> sigmaarr = uarr;
                    const Box& ovlp2 = ccvbx & ccbxg1;
                    if (sigma_orig) {
                        Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (ovlp2.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sigmaarr(i,j,k) = sigmaarr_orig(i,j,k);
                            } else {
                                sigmaarr(i,j,k) = 0.0;
                            }
                        });
                    } else {
                        Real const_sigma = m_const_sigma;
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (ovlp2.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sigmaarr(i,j,k) = const_sigma;
                            } else {
                                sigmaarr(i,j,k) = 0.0;
                            }
                        });
                    }

#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i,j,k, phiarr, sigmaarr, tmpmaskarr,
                                                                   is_rz, dxinv);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
#else
                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i,j,k, phiarr, sigmaarr, tmpmaskarr,
                                                                   dxinv);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
#endif
                }
            }

            // Do not impose neumann bc here because how SyncRegister works.
        }
    }
}